

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx2::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  int iVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  uint uVar57;
  uint uVar58;
  ulong uVar59;
  ulong uVar60;
  long lVar61;
  byte bVar62;
  uint uVar63;
  uint uVar64;
  long lVar65;
  uint uVar66;
  float fVar67;
  float fVar68;
  undefined4 uVar69;
  float fVar95;
  float fVar96;
  vint4 bi_2;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar97;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined8 uVar98;
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 extraout_var [56];
  float fVar126;
  float fVar139;
  float fVar140;
  vint4 bi;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar141;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar142;
  float fVar162;
  float fVar163;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar164;
  undefined1 auVar147 [16];
  float fVar143;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar144;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 ai_2;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  float fVar180;
  float fVar200;
  float fVar201;
  vint4 ai_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  vint4 ai;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  float fVar231;
  float fVar232;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar233;
  undefined1 auVar230 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar291 [16];
  undefined1 auVar244 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar245 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar251;
  float fVar265;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [64];
  undefined1 auVar290 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [32];
  float fVar312;
  float fVar324;
  float fVar325;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar326;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar318 [16];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar334 [32];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_608 [8];
  undefined8 uStack_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  undefined1 local_568 [8];
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  undefined1 local_518 [32];
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [16];
  undefined1 (*local_458) [16];
  Primitive *local_450;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 auStack_438 [16];
  RTCFilterFunctionNArguments local_428;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  uint auStack_388 [4];
  uint local_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  uint uStack_248;
  float afStack_244 [7];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  undefined1 auVar333 [32];
  
  PVar6 = prim[1];
  uVar59 = (ulong)(byte)PVar6;
  lVar61 = uVar59 * 0x25;
  auVar158 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar158 = vinsertps_avx(auVar158,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar159 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar159 = vinsertps_avx(auVar159,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar67 = *(float *)(prim + lVar61 + 0x12);
  auVar158 = vsubps_avx(auVar158,*(undefined1 (*) [16])(prim + lVar61 + 6));
  auVar291._0_4_ = fVar67 * auVar158._0_4_;
  auVar291._4_4_ = fVar67 * auVar158._4_4_;
  auVar291._8_4_ = fVar67 * auVar158._8_4_;
  auVar291._12_4_ = fVar67 * auVar158._12_4_;
  auVar107._0_4_ = fVar67 * auVar159._0_4_;
  auVar107._4_4_ = fVar67 * auVar159._4_4_;
  auVar107._8_4_ = fVar67 * auVar159._8_4_;
  auVar107._12_4_ = fVar67 * auVar159._12_4_;
  auVar158 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar159 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar155 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xf + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar59 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x1a + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x1b + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x1c + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar313._4_4_ = auVar107._0_4_;
  auVar313._0_4_ = auVar107._0_4_;
  auVar313._8_4_ = auVar107._0_4_;
  auVar313._12_4_ = auVar107._0_4_;
  auVar22 = vshufps_avx(auVar107,auVar107,0x55);
  auVar327 = vshufps_avx(auVar107,auVar107,0xaa);
  fVar67 = auVar327._0_4_;
  auVar266._0_4_ = fVar67 * auVar155._0_4_;
  fVar95 = auVar327._4_4_;
  auVar266._4_4_ = fVar95 * auVar155._4_4_;
  fVar96 = auVar327._8_4_;
  auVar266._8_4_ = fVar96 * auVar155._8_4_;
  fVar144 = auVar327._12_4_;
  auVar266._12_4_ = fVar144 * auVar155._12_4_;
  auVar252._0_4_ = auVar18._0_4_ * fVar67;
  auVar252._4_4_ = auVar18._4_4_ * fVar95;
  auVar252._8_4_ = auVar18._8_4_ * fVar96;
  auVar252._12_4_ = auVar18._12_4_ * fVar144;
  auVar237._0_4_ = auVar21._0_4_ * fVar67;
  auVar237._4_4_ = auVar21._4_4_ * fVar95;
  auVar237._8_4_ = auVar21._8_4_ * fVar96;
  auVar237._12_4_ = auVar21._12_4_ * fVar144;
  auVar327 = vfmadd231ps_fma(auVar266,auVar22,auVar159);
  auVar243 = vfmadd231ps_fma(auVar252,auVar22,auVar17);
  auVar22 = vfmadd231ps_fma(auVar237,auVar20,auVar22);
  auVar71 = vfmadd231ps_fma(auVar327,auVar313,auVar158);
  auVar243 = vfmadd231ps_fma(auVar243,auVar313,auVar16);
  auVar72 = vfmadd231ps_fma(auVar22,auVar19,auVar313);
  auVar314._4_4_ = auVar291._0_4_;
  auVar314._0_4_ = auVar291._0_4_;
  auVar314._8_4_ = auVar291._0_4_;
  auVar314._12_4_ = auVar291._0_4_;
  auVar22 = vshufps_avx(auVar291,auVar291,0x55);
  auVar327 = vshufps_avx(auVar291,auVar291,0xaa);
  fVar67 = auVar327._0_4_;
  auVar285._0_4_ = fVar67 * auVar155._0_4_;
  fVar95 = auVar327._4_4_;
  auVar285._4_4_ = fVar95 * auVar155._4_4_;
  fVar96 = auVar327._8_4_;
  auVar285._8_4_ = fVar96 * auVar155._8_4_;
  fVar144 = auVar327._12_4_;
  auVar285._12_4_ = fVar144 * auVar155._12_4_;
  auVar99._0_4_ = auVar18._0_4_ * fVar67;
  auVar99._4_4_ = auVar18._4_4_ * fVar95;
  auVar99._8_4_ = auVar18._8_4_ * fVar96;
  auVar99._12_4_ = auVar18._12_4_ * fVar144;
  auVar70._0_4_ = auVar21._0_4_ * fVar67;
  auVar70._4_4_ = auVar21._4_4_ * fVar95;
  auVar70._8_4_ = auVar21._8_4_ * fVar96;
  auVar70._12_4_ = auVar21._12_4_ * fVar144;
  auVar159 = vfmadd231ps_fma(auVar285,auVar22,auVar159);
  auVar155 = vfmadd231ps_fma(auVar99,auVar22,auVar17);
  auVar17 = vfmadd231ps_fma(auVar70,auVar22,auVar20);
  auVar99 = vfmadd231ps_fma(auVar159,auVar314,auVar158);
  auVar100 = vfmadd231ps_fma(auVar155,auVar314,auVar16);
  local_398._8_4_ = 0x7fffffff;
  local_398._0_8_ = 0x7fffffff7fffffff;
  local_398._12_4_ = 0x7fffffff;
  auVar158 = vandps_avx(auVar71,local_398);
  auVar218._8_4_ = 0x219392ef;
  auVar218._0_8_ = 0x219392ef219392ef;
  auVar218._12_4_ = 0x219392ef;
  auVar158 = vcmpps_avx(auVar158,auVar218,1);
  auVar159 = vblendvps_avx(auVar71,auVar218,auVar158);
  auVar158 = vandps_avx(auVar243,local_398);
  auVar158 = vcmpps_avx(auVar158,auVar218,1);
  auVar155 = vblendvps_avx(auVar243,auVar218,auVar158);
  auVar158 = vandps_avx(auVar72,local_398);
  auVar158 = vcmpps_avx(auVar158,auVar218,1);
  auVar158 = vblendvps_avx(auVar72,auVar218,auVar158);
  auVar101 = vfmadd231ps_fma(auVar17,auVar314,auVar19);
  auVar16 = vrcpps_avx(auVar159);
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = 0x3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar159 = vfnmadd213ps_fma(auVar159,auVar16,auVar219);
  auVar71 = vfmadd132ps_fma(auVar159,auVar16,auVar16);
  auVar159 = vrcpps_avx(auVar155);
  auVar155 = vfnmadd213ps_fma(auVar155,auVar159,auVar219);
  auVar72 = vfmadd132ps_fma(auVar155,auVar159,auVar159);
  auVar159 = vrcpps_avx(auVar158);
  auVar158 = vfnmadd213ps_fma(auVar158,auVar159,auVar219);
  auVar291 = vfmadd132ps_fma(auVar158,auVar159,auVar159);
  fVar67 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar61 + 0x16)) *
           *(float *)(prim + lVar61 + 0x1a);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar158 = vpmovsxwd_avx(auVar158);
  auVar188._4_4_ = fVar67;
  auVar188._0_4_ = fVar67;
  auVar188._8_4_ = fVar67;
  auVar188._12_4_ = fVar67;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + uVar59 * 0xb + 6);
  auVar159 = vpmovsxwd_avx(auVar159);
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,auVar158);
  auVar70 = vfmadd213ps_fma(auVar159,auVar188,auVar158);
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar158 = vpmovsxwd_avx(auVar155);
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar59 * 0xd + 6);
  auVar159 = vpmovsxwd_avx(auVar16);
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,auVar158);
  auVar155 = vfmadd213ps_fma(auVar159,auVar188,auVar158);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar59 * 0x12 + 6);
  auVar158 = vpmovsxwd_avx(auVar17);
  uVar60 = (ulong)(uint)((int)(uVar59 * 5) << 2);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar59 * 2 + uVar60 + 6);
  auVar159 = vpmovsxwd_avx(auVar18);
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,auVar158);
  auVar16 = vfmadd213ps_fma(auVar159,auVar188,auVar158);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar60 + 6);
  auVar158 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar59 * 0x18 + 6);
  auVar159 = vpmovsxwd_avx(auVar20);
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,auVar158);
  auVar17 = vfmadd213ps_fma(auVar159,auVar188,auVar158);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar59 * 0x1d + 6);
  auVar158 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar59 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar159 = vpmovsxwd_avx(auVar22);
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,auVar158);
  auVar18 = vfmadd213ps_fma(auVar159,auVar188,auVar158);
  auVar327._8_8_ = 0;
  auVar327._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar59) + 6);
  auVar158 = vpmovsxwd_avx(auVar327);
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = *(ulong *)(prim + uVar59 * 0x23 + 6);
  auVar159 = vpmovsxwd_avx(auVar243);
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,auVar158);
  auVar159 = vfmadd213ps_fma(auVar159,auVar188,auVar158);
  auVar158 = vsubps_avx(auVar70,auVar99);
  auVar202._0_4_ = auVar71._0_4_ * auVar158._0_4_;
  auVar202._4_4_ = auVar71._4_4_ * auVar158._4_4_;
  auVar202._8_4_ = auVar71._8_4_ * auVar158._8_4_;
  auVar202._12_4_ = auVar71._12_4_ * auVar158._12_4_;
  auVar158 = vsubps_avx(auVar155,auVar99);
  auVar127._0_4_ = auVar71._0_4_ * auVar158._0_4_;
  auVar127._4_4_ = auVar71._4_4_ * auVar158._4_4_;
  auVar127._8_4_ = auVar71._8_4_ * auVar158._8_4_;
  auVar127._12_4_ = auVar71._12_4_ * auVar158._12_4_;
  auVar158 = vsubps_avx(auVar16,auVar100);
  auVar181._0_4_ = auVar72._0_4_ * auVar158._0_4_;
  auVar181._4_4_ = auVar72._4_4_ * auVar158._4_4_;
  auVar181._8_4_ = auVar72._8_4_ * auVar158._8_4_;
  auVar181._12_4_ = auVar72._12_4_ * auVar158._12_4_;
  auVar158 = vsubps_avx(auVar17,auVar100);
  auVar100._0_4_ = auVar72._0_4_ * auVar158._0_4_;
  auVar100._4_4_ = auVar72._4_4_ * auVar158._4_4_;
  auVar100._8_4_ = auVar72._8_4_ * auVar158._8_4_;
  auVar100._12_4_ = auVar72._12_4_ * auVar158._12_4_;
  auVar158 = vsubps_avx(auVar18,auVar101);
  auVar152._0_4_ = auVar291._0_4_ * auVar158._0_4_;
  auVar152._4_4_ = auVar291._4_4_ * auVar158._4_4_;
  auVar152._8_4_ = auVar291._8_4_ * auVar158._8_4_;
  auVar152._12_4_ = auVar291._12_4_ * auVar158._12_4_;
  auVar158 = vsubps_avx(auVar159,auVar101);
  auVar71._0_4_ = auVar291._0_4_ * auVar158._0_4_;
  auVar71._4_4_ = auVar291._4_4_ * auVar158._4_4_;
  auVar71._8_4_ = auVar291._8_4_ * auVar158._8_4_;
  auVar71._12_4_ = auVar291._12_4_ * auVar158._12_4_;
  auVar158 = vpminsd_avx(auVar202,auVar127);
  auVar159 = vpminsd_avx(auVar181,auVar100);
  auVar158 = vmaxps_avx(auVar158,auVar159);
  auVar159 = vpminsd_avx(auVar152,auVar71);
  uVar69 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar238._4_4_ = uVar69;
  auVar238._0_4_ = uVar69;
  auVar238._8_4_ = uVar69;
  auVar238._12_4_ = uVar69;
  auVar159 = vmaxps_avx(auVar159,auVar238);
  auVar158 = vmaxps_avx(auVar158,auVar159);
  local_358._0_4_ = auVar158._0_4_ * 0.99999964;
  local_358._4_4_ = auVar158._4_4_ * 0.99999964;
  local_358._8_4_ = auVar158._8_4_ * 0.99999964;
  local_358._12_4_ = auVar158._12_4_ * 0.99999964;
  auVar158 = vpmaxsd_avx(auVar202,auVar127);
  auVar159 = vpmaxsd_avx(auVar181,auVar100);
  auVar158 = vminps_avx(auVar158,auVar159);
  auVar159 = vpmaxsd_avx(auVar152,auVar71);
  uVar69 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar128._4_4_ = uVar69;
  auVar128._0_4_ = uVar69;
  auVar128._8_4_ = uVar69;
  auVar128._12_4_ = uVar69;
  auVar159 = vminps_avx(auVar159,auVar128);
  auVar158 = vminps_avx(auVar158,auVar159);
  auVar72._0_4_ = auVar158._0_4_ * 1.0000004;
  auVar72._4_4_ = auVar158._4_4_ * 1.0000004;
  auVar72._8_4_ = auVar158._8_4_ * 1.0000004;
  auVar72._12_4_ = auVar158._12_4_ * 1.0000004;
  auVar101._1_3_ = 0;
  auVar101[0] = PVar6;
  auVar101[4] = PVar6;
  auVar101._5_3_ = 0;
  auVar101[8] = PVar6;
  auVar101._9_3_ = 0;
  auVar101[0xc] = PVar6;
  auVar101._13_3_ = 0;
  auVar159 = vpcmpgtd_avx(auVar101,_DAT_01f7fcf0);
  auVar158 = vcmpps_avx(local_358,auVar72,2);
  auVar158 = vandps_avx(auVar158,auVar159);
  uVar57 = vmovmskps_avx(auVar158);
  if (uVar57 == 0) {
    return;
  }
  uVar57 = uVar57 & 0xff;
  auVar92._16_16_ = mm_lookupmask_ps._240_16_;
  auVar92._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar92,ZEXT832(0) << 0x20,0x80);
  local_458 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_450 = prim;
  do {
    lVar61 = 0;
    for (uVar59 = (ulong)uVar57; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
      lVar61 = lVar61 + 1;
    }
    uVar58 = *(uint *)(local_450 + 2);
    uVar7 = *(uint *)(local_450 + lVar61 * 4 + 6);
    pGVar8 = (context->scene->geometries).items[uVar58].ptr;
    fVar67 = (pGVar8->time_range).lower;
    fVar96 = pGVar8->fnumTimeSegments *
             ((*(float *)(ray + k * 4 + 0x70) - fVar67) / ((pGVar8->time_range).upper - fVar67));
    auVar158 = vroundss_avx(ZEXT416((uint)fVar96),ZEXT416((uint)fVar96),9);
    auVar158 = vminss_avx(auVar158,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
    auVar22 = vmaxss_avx(ZEXT816(0),auVar158);
    uVar59 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                             (ulong)uVar7 *
                             pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar65 = (long)(int)auVar22._0_4_ * 0x38;
    lVar10 = *(long *)(_Var9 + lVar65);
    lVar11 = *(long *)(_Var9 + 0x10 + lVar65);
    auVar158 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar59);
    lVar61 = uVar59 + 1;
    auVar159 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar61);
    lVar1 = uVar59 + 2;
    auVar155 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
    lVar2 = uVar59 + 3;
    pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
    auVar55 = *pauVar3;
    fVar67 = *(float *)pauVar3[1];
    lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
    lVar11 = *(long *)(lVar10 + lVar65);
    lVar12 = *(long *)(lVar10 + 0x10 + lVar65);
    auVar16 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar59);
    auVar17 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar61);
    auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
    pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
    fVar95 = *pfVar4;
    fVar144 = pfVar4[1];
    fVar68 = pfVar4[2];
    fVar143 = pfVar4[3];
    auVar327 = ZEXT816(0) << 0x40;
    auVar290._0_4_ = *(float *)*pauVar3 * 0.0;
    auVar290._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
    auVar290._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
    auVar290._12_4_ = fVar67 * 0.0;
    auVar239._8_4_ = 0x3e2aaaab;
    auVar239._0_8_ = 0x3e2aaaab3e2aaaab;
    auVar239._12_4_ = 0x3e2aaaab;
    auVar71 = vfmadd213ps_fma(auVar239,auVar155,auVar290);
    auVar299._8_4_ = 0x3f000000;
    auVar299._0_8_ = 0x3f0000003f000000;
    auVar299._12_4_ = 0x3f000000;
    auVar19 = vfmadd231ps_fma(auVar290,auVar155,auVar299);
    auVar19 = vfnmadd231ps_fma(auVar19,auVar159,auVar327);
    auVar127 = vfnmadd231ps_fma(auVar19,auVar158,auVar299);
    auVar182._0_4_ = fVar95 * 0.0;
    auVar182._4_4_ = fVar144 * 0.0;
    auVar182._8_4_ = fVar68 * 0.0;
    auVar182._12_4_ = fVar143 * 0.0;
    auVar19 = vfmadd213ps_fma(auVar239,auVar18,auVar182);
    auVar145._8_4_ = 0x3f2aaaab;
    auVar145._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar145._12_4_ = 0x3f2aaaab;
    auVar19 = vfmadd231ps_fma(auVar19,auVar17,auVar145);
    auVar19 = vfmadd231ps_fma(auVar19,auVar16,auVar239);
    auVar20 = vfmadd231ps_fma(auVar182,auVar18,auVar299);
    auVar20 = vfnmadd231ps_fma(auVar20,auVar17,auVar327);
    auVar21 = vfnmadd231ps_fma(auVar20,auVar16,auVar299);
    auVar315._0_4_ = *(float *)*pauVar3 * 0.5;
    auVar315._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
    auVar315._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
    auVar315._12_4_ = fVar67 * 0.5;
    auVar20 = vfmadd231ps_fma(auVar315,auVar327,auVar155);
    auVar20 = vfnmadd231ps_fma(auVar20,auVar299,auVar159);
    auVar128 = vfnmadd231ps_fma(auVar20,auVar327,auVar158);
    auVar253._0_4_ = fVar95 * 0.16666667;
    auVar253._4_4_ = fVar144 * 0.16666667;
    auVar253._8_4_ = fVar68 * 0.16666667;
    auVar253._12_4_ = fVar143 * 0.16666667;
    auVar20 = vfmadd231ps_fma(auVar253,auVar18,auVar145);
    auVar20 = vfmadd231ps_fma(auVar20,auVar17,auVar239);
    auVar20 = vfmadd231ps_fma(auVar20,auVar16,auVar327);
    auVar220._0_4_ = fVar95 * 0.5;
    auVar220._4_4_ = fVar144 * 0.5;
    auVar220._8_4_ = fVar68 * 0.5;
    auVar220._12_4_ = fVar143 * 0.5;
    auVar18 = vfmadd231ps_fma(auVar220,auVar327,auVar18);
    auVar17 = vfnmadd231ps_fma(auVar18,auVar299,auVar17);
    auVar18 = vfnmadd231ps_fma(auVar17,auVar327,auVar16);
    auVar16 = vshufps_avx(auVar127,auVar127,0xc9);
    auVar17 = vshufps_avx(auVar19,auVar19,0xc9);
    fVar236 = auVar127._0_4_;
    auVar102._0_4_ = fVar236 * auVar17._0_4_;
    fVar251 = auVar127._4_4_;
    auVar102._4_4_ = fVar251 * auVar17._4_4_;
    fVar265 = auVar127._8_4_;
    auVar102._8_4_ = fVar265 * auVar17._8_4_;
    fVar97 = auVar127._12_4_;
    auVar102._12_4_ = fVar97 * auVar17._12_4_;
    auVar291 = vfmsub231ps_fma(auVar102,auVar16,auVar19);
    auVar17 = vshufps_avx(auVar21,auVar21,0xc9);
    auVar103._0_4_ = fVar236 * auVar17._0_4_;
    auVar103._4_4_ = fVar251 * auVar17._4_4_;
    auVar103._8_4_ = fVar265 * auVar17._8_4_;
    auVar103._12_4_ = fVar97 * auVar17._12_4_;
    auVar70 = vfmsub231ps_fma(auVar103,auVar16,auVar21);
    auVar16 = vshufps_avx(auVar128,auVar128,0xc9);
    auVar17 = vshufps_avx(auVar20,auVar20,0xc9);
    fVar312 = auVar128._0_4_;
    auVar104._0_4_ = fVar312 * auVar17._0_4_;
    fVar324 = auVar128._4_4_;
    auVar104._4_4_ = fVar324 * auVar17._4_4_;
    fVar325 = auVar128._8_4_;
    auVar104._8_4_ = fVar325 * auVar17._8_4_;
    fVar326 = auVar128._12_4_;
    auVar104._12_4_ = fVar326 * auVar17._12_4_;
    auVar99 = vfmsub231ps_fma(auVar104,auVar16,auVar20);
    auVar17 = vshufps_avx(auVar18,auVar18,0xc9);
    auVar105._0_4_ = fVar312 * auVar17._0_4_;
    auVar105._4_4_ = fVar324 * auVar17._4_4_;
    auVar105._8_4_ = fVar325 * auVar17._8_4_;
    auVar105._12_4_ = fVar326 * auVar17._12_4_;
    auVar100 = vfmsub231ps_fma(auVar105,auVar16,auVar18);
    lVar11 = *(long *)(_Var9 + 0x38 + lVar65);
    lVar12 = *(long *)(_Var9 + 0x48 + lVar65);
    auVar16 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
    pauVar3 = (undefined1 (*) [12])(lVar11 + lVar12 * lVar2);
    auVar56 = *pauVar3;
    fVar143 = *(float *)pauVar3[1];
    lVar13 = *(long *)(lVar10 + 0x38 + lVar65);
    lVar10 = *(long *)(lVar10 + 0x48 + lVar65);
    auVar254._0_4_ = *(float *)*pauVar3 * 0.0;
    auVar254._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
    auVar254._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
    auVar254._12_4_ = fVar143 * 0.0;
    auVar72 = vfmadd213ps_fma(auVar239,auVar16,auVar254);
    auVar18 = vfmadd231ps_fma(auVar254,auVar16,auVar299);
    auVar17 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar61);
    auVar19 = vfnmadd231ps_fma(auVar18,auVar17,ZEXT816(0) << 0x20);
    auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar59);
    auVar152 = vfnmadd231ps_fma(auVar19,auVar18,auVar299);
    auVar19 = *(undefined1 (*) [16])(lVar13 + lVar1 * lVar10);
    pfVar4 = (float *)(lVar13 + lVar10 * lVar2);
    fVar95 = *pfVar4;
    fVar144 = pfVar4[1];
    fVar68 = pfVar4[2];
    fVar126 = pfVar4[3];
    auVar73._0_4_ = fVar95 * 0.0;
    auVar73._4_4_ = fVar144 * 0.0;
    auVar73._8_4_ = fVar68 * 0.0;
    auVar73._12_4_ = fVar126 * 0.0;
    auVar21 = vfmadd213ps_fma(auVar239,auVar19,auVar73);
    auVar20 = *(undefined1 (*) [16])(lVar13 + lVar61 * lVar10);
    auVar106._8_4_ = 0x3f2aaaab;
    auVar106._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar106._12_4_ = 0x3f2aaaab;
    auVar327 = vfmadd231ps_fma(auVar21,auVar20,auVar106);
    auVar21 = *(undefined1 (*) [16])(lVar13 + uVar59 * lVar10);
    auVar243 = vfmadd231ps_fma(auVar327,auVar21,auVar239);
    auVar327 = vshufps_avx(auVar243,auVar243,0xc9);
    fVar232 = auVar152._0_4_;
    auVar183._0_4_ = fVar232 * auVar327._0_4_;
    fVar233 = auVar152._4_4_;
    auVar183._4_4_ = fVar233 * auVar327._4_4_;
    fVar234 = auVar152._8_4_;
    auVar183._8_4_ = fVar234 * auVar327._8_4_;
    fVar235 = auVar152._12_4_;
    auVar183._12_4_ = fVar235 * auVar327._12_4_;
    auVar327 = vshufps_avx(auVar152,auVar152,0xc9);
    auVar101 = vfmsub231ps_fma(auVar183,auVar327,auVar243);
    auVar184._8_4_ = 0x3f000000;
    auVar184._0_8_ = 0x3f0000003f000000;
    auVar184._12_4_ = 0x3f000000;
    auVar243 = vfmadd231ps_fma(auVar73,auVar19,auVar184);
    auVar243 = vfnmadd231ps_fma(auVar243,auVar20,_DAT_01f7aa10);
    auVar107 = vfnmadd231ps_fma(auVar243,auVar21,auVar184);
    auVar243 = vshufps_avx(auVar107,auVar107,0xc9);
    auVar279._0_4_ = fVar232 * auVar243._0_4_;
    auVar279._4_4_ = fVar233 * auVar243._4_4_;
    auVar279._8_4_ = fVar234 * auVar243._8_4_;
    auVar279._12_4_ = fVar235 * auVar243._12_4_;
    auVar243 = vfmsub231ps_fma(auVar279,auVar327,auVar107);
    auVar74._0_4_ = fVar95 * 0.16666667;
    auVar74._4_4_ = fVar144 * 0.16666667;
    auVar74._8_4_ = fVar68 * 0.16666667;
    auVar74._12_4_ = fVar126 * 0.16666667;
    auVar203._8_4_ = 0x3f2aaaab;
    auVar203._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar203._12_4_ = 0x3f2aaaab;
    auVar327 = vfmadd231ps_fma(auVar74,auVar19,auVar203);
    auVar146._0_4_ = fVar95 * 0.5;
    auVar146._4_4_ = fVar144 * 0.5;
    auVar146._8_4_ = fVar68 * 0.5;
    auVar146._12_4_ = fVar126 * 0.5;
    auVar107 = ZEXT816(0) << 0x20;
    auVar19 = vfmadd231ps_fma(auVar146,auVar107,auVar19);
    auVar327 = vfmadd231ps_fma(auVar327,auVar20,auVar239);
    auVar19 = vfnmadd231ps_fma(auVar19,auVar184,auVar20);
    auVar20 = vfmadd231ps_fma(auVar327,auVar21,auVar107);
    auVar21 = vfnmadd231ps_fma(auVar19,auVar107,auVar21);
    auVar185._0_4_ = *(float *)*pauVar3 * 0.5;
    auVar185._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
    auVar185._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
    auVar185._12_4_ = fVar143 * 0.5;
    auVar19 = vfmadd231ps_fma(auVar185,auVar107,auVar16);
    auVar19 = vfnmadd231ps_fma(auVar19,auVar184,auVar17);
    auVar181 = vfnmadd231ps_fma(auVar19,auVar107,auVar18);
    auVar19 = vshufps_avx(auVar20,auVar20,0xc9);
    fVar180 = auVar181._0_4_;
    auVar108._0_4_ = fVar180 * auVar19._0_4_;
    fVar200 = auVar181._4_4_;
    auVar108._4_4_ = fVar200 * auVar19._4_4_;
    fVar201 = auVar181._8_4_;
    auVar108._8_4_ = fVar201 * auVar19._8_4_;
    fVar231 = auVar181._12_4_;
    auVar108._12_4_ = fVar231 * auVar19._12_4_;
    auVar19 = vshufps_avx(auVar181,auVar181,0xc9);
    auVar107 = vfmsub231ps_fma(auVar108,auVar19,auVar20);
    auVar20 = vshufps_avx(auVar21,auVar21,0xc9);
    auVar75._0_4_ = fVar180 * auVar20._0_4_;
    auVar75._4_4_ = fVar200 * auVar20._4_4_;
    auVar75._8_4_ = fVar201 * auVar20._8_4_;
    auVar75._12_4_ = fVar231 * auVar20._12_4_;
    auVar285 = vfmsub231ps_fma(auVar75,auVar19,auVar21);
    fVar96 = fVar96 - auVar22._0_4_;
    local_538._0_4_ = auVar55._0_4_;
    local_538._4_4_ = auVar55._4_4_;
    fStack_530 = auVar55._8_4_;
    auVar109._0_4_ = (float)local_538._0_4_ * 0.16666667;
    auVar109._4_4_ = (float)local_538._4_4_ * 0.16666667;
    auVar109._8_4_ = fStack_530 * 0.16666667;
    auVar109._12_4_ = fVar67 * 0.16666667;
    auVar155 = vfmadd231ps_fma(auVar109,auVar203,auVar155);
    auVar19 = vfmadd231ps_fma(auVar71,auVar159,auVar203);
    auVar20 = vfmadd231ps_fma(auVar155,auVar159,auVar239);
    auVar22 = vfmadd231ps_fma(auVar19,auVar158,auVar239);
    auVar155 = vpermilps_avx(auVar291,0xc9);
    auVar159 = vdpps_avx(auVar155,auVar155,0x7f);
    auVar327 = vfmadd231ps_fma(auVar20,auVar158,ZEXT816(0) << 0x20);
    fVar95 = auVar159._0_4_;
    auVar165._4_12_ = SUB1612(ZEXT816(0),0);
    auVar165._0_4_ = fVar95;
    auVar158 = vrsqrtss_avx(auVar165,auVar165);
    fVar67 = auVar158._0_4_;
    fVar67 = fVar95 * -0.5 * fVar67 * fVar67 * fVar67 + fVar67 * 1.5;
    auVar158 = vpermilps_avx(auVar70,0xc9);
    auVar328._0_4_ = fVar95 * auVar158._0_4_;
    auVar328._4_4_ = fVar95 * auVar158._4_4_;
    auVar328._8_4_ = fVar95 * auVar158._8_4_;
    auVar328._12_4_ = fVar95 * auVar158._12_4_;
    auVar158 = vdpps_avx(auVar155,auVar158,0x7f);
    fVar95 = auVar158._0_4_;
    auVar240._0_4_ = fVar95 * auVar155._0_4_;
    auVar240._4_4_ = fVar95 * auVar155._4_4_;
    auVar240._8_4_ = fVar95 * auVar155._8_4_;
    auVar240._12_4_ = fVar95 * auVar155._12_4_;
    auVar19 = vsubps_avx(auVar328,auVar240);
    auVar158 = vrcpss_avx(auVar165,auVar165);
    auVar159 = vfnmadd213ss_fma(auVar159,auVar158,SUB6416(ZEXT464(0x40000000),0));
    fVar144 = auVar158._0_4_ * auVar159._0_4_;
    fVar126 = auVar155._0_4_ * fVar67;
    fVar139 = auVar155._4_4_ * fVar67;
    fVar140 = auVar155._8_4_ * fVar67;
    fVar141 = auVar155._12_4_ * fVar67;
    auVar20 = vpermilps_avx(auVar99,0xc9);
    auVar159 = vdpps_avx(auVar20,auVar20,0x7f);
    auVar158 = vblendps_avx(auVar159,_DAT_01f7aa10,0xe);
    auVar155 = vrsqrtss_avx(auVar158,auVar158);
    fVar68 = auVar159._0_4_;
    fVar95 = auVar155._0_4_;
    auVar21 = vpermilps_avx(auVar100,0xc9);
    auVar155 = vdpps_avx(auVar20,auVar21,0x7f);
    fVar95 = fVar95 * 1.5 + fVar95 * fVar95 * fVar95 * fVar68 * -0.5;
    auVar280._0_4_ = fVar68 * auVar21._0_4_;
    auVar280._4_4_ = fVar68 * auVar21._4_4_;
    auVar280._8_4_ = fVar68 * auVar21._8_4_;
    auVar280._12_4_ = fVar68 * auVar21._12_4_;
    fVar68 = auVar155._0_4_;
    auVar76._0_4_ = fVar68 * auVar20._0_4_;
    auVar76._4_4_ = fVar68 * auVar20._4_4_;
    auVar76._8_4_ = fVar68 * auVar20._8_4_;
    auVar76._12_4_ = fVar68 * auVar20._12_4_;
    auVar155 = vsubps_avx(auVar280,auVar76);
    auVar158 = vrcpss_avx(auVar158,auVar158);
    auVar71 = SUB6416(ZEXT464(0x40000000),0);
    auVar159 = vfnmadd213ss_fma(auVar159,auVar158,auVar71);
    fVar68 = auVar158._0_4_ * auVar159._0_4_;
    fVar142 = auVar20._0_4_ * fVar95;
    fVar162 = auVar20._4_4_ * fVar95;
    fVar163 = auVar20._8_4_ * fVar95;
    fVar164 = auVar20._12_4_ * fVar95;
    auVar158 = vshufps_avx(auVar127,auVar127,0xff);
    auVar159 = vshufps_avx(auVar22,auVar22,0xff);
    auVar241._0_4_ = auVar159._0_4_ * fVar126;
    auVar241._4_4_ = auVar159._4_4_ * fVar139;
    auVar241._8_4_ = auVar159._8_4_ * fVar140;
    auVar241._12_4_ = auVar159._12_4_ * fVar141;
    auVar166._0_4_ = auVar158._0_4_ * fVar126 + fVar67 * auVar19._0_4_ * fVar144 * auVar159._0_4_;
    auVar166._4_4_ = auVar158._4_4_ * fVar139 + fVar67 * auVar19._4_4_ * fVar144 * auVar159._4_4_;
    auVar166._8_4_ = auVar158._8_4_ * fVar140 + fVar67 * auVar19._8_4_ * fVar144 * auVar159._8_4_;
    auVar166._12_4_ =
         auVar158._12_4_ * fVar141 + fVar67 * auVar19._12_4_ * fVar144 * auVar159._12_4_;
    auVar19 = vsubps_avx(auVar22,auVar241);
    local_5b8._0_4_ = auVar241._0_4_ + auVar22._0_4_;
    local_5b8._4_4_ = auVar241._4_4_ + auVar22._4_4_;
    fStack_5b0 = auVar241._8_4_ + auVar22._8_4_;
    fStack_5ac = auVar241._12_4_ + auVar22._12_4_;
    auVar20 = vsubps_avx(auVar127,auVar166);
    auVar158 = vshufps_avx(auVar128,auVar128,0xff);
    auVar159 = vshufps_avx(auVar327,auVar327,0xff);
    auVar147._0_4_ = auVar159._0_4_ * fVar142;
    auVar147._4_4_ = auVar159._4_4_ * fVar162;
    auVar147._8_4_ = auVar159._8_4_ * fVar163;
    auVar147._12_4_ = auVar159._12_4_ * fVar164;
    auVar167._0_4_ = auVar158._0_4_ * fVar142 + auVar159._0_4_ * fVar95 * auVar155._0_4_ * fVar68;
    auVar167._4_4_ = auVar158._4_4_ * fVar162 + auVar159._4_4_ * fVar95 * auVar155._4_4_ * fVar68;
    auVar167._8_4_ = auVar158._8_4_ * fVar163 + auVar159._8_4_ * fVar95 * auVar155._8_4_ * fVar68;
    auVar167._12_4_ =
         auVar158._12_4_ * fVar164 + auVar159._12_4_ * fVar95 * auVar155._12_4_ * fVar68;
    auVar155 = vsubps_avx(auVar327,auVar147);
    local_538._4_4_ = auVar327._4_4_ + auVar147._4_4_;
    local_538._0_4_ = auVar327._0_4_ + auVar147._0_4_;
    fStack_530 = auVar327._8_4_ + auVar147._8_4_;
    fStack_52c = auVar327._12_4_ + auVar147._12_4_;
    auVar21 = vsubps_avx(auVar128,auVar167);
    auVar77._8_4_ = 0x3e2aaaab;
    auVar77._0_8_ = 0x3e2aaaab3e2aaaab;
    auVar77._12_4_ = 0x3e2aaaab;
    local_5a8 = auVar56._0_4_;
    fStack_5a4 = auVar56._4_4_;
    fStack_5a0 = auVar56._8_4_;
    auVar300._0_4_ = local_5a8 * 0.16666667;
    auVar300._4_4_ = fStack_5a4 * 0.16666667;
    auVar300._8_4_ = fStack_5a0 * 0.16666667;
    auVar300._12_4_ = fVar143 * 0.16666667;
    auVar148._8_4_ = 0x3f2aaaab;
    auVar148._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar148._12_4_ = 0x3f2aaaab;
    auVar158 = vfmadd231ps_fma(auVar300,auVar148,auVar16);
    auVar159 = vfmadd231ps_fma(auVar72,auVar17,auVar148);
    auVar16 = vfmadd231ps_fma(auVar158,auVar17,auVar77);
    auVar22 = vfmadd231ps_fma(auVar159,auVar18,auVar77);
    auVar17 = vpermilps_avx(auVar101,0xc9);
    auVar158 = vdpps_avx(auVar17,auVar17,0x7f);
    auVar327 = vfmadd231ps_fma(auVar16,auVar18,ZEXT816(0) << 0x40);
    fVar95 = auVar158._0_4_;
    auVar168._4_12_ = ZEXT812(0) << 0x20;
    auVar168._0_4_ = fVar95;
    auVar159 = vrsqrtss_avx(auVar168,auVar168);
    fVar67 = auVar159._0_4_;
    fVar67 = fVar95 * -0.5 * fVar67 * fVar67 * fVar67 + fVar67 * 1.5;
    auVar159 = vpermilps_avx(auVar243,0xc9);
    auVar267._0_4_ = fVar95 * auVar159._0_4_;
    auVar267._4_4_ = fVar95 * auVar159._4_4_;
    auVar267._8_4_ = fVar95 * auVar159._8_4_;
    auVar267._12_4_ = fVar95 * auVar159._12_4_;
    auVar159 = vdpps_avx(auVar17,auVar159,0x7f);
    fVar95 = auVar159._0_4_;
    auVar242._0_4_ = fVar95 * auVar17._0_4_;
    auVar242._4_4_ = fVar95 * auVar17._4_4_;
    auVar242._8_4_ = fVar95 * auVar17._8_4_;
    auVar242._12_4_ = fVar95 * auVar17._12_4_;
    auVar16 = vsubps_avx(auVar267,auVar242);
    auVar159 = vrcpss_avx(auVar168,auVar168);
    auVar158 = vfnmadd213ss_fma(auVar158,auVar159,auVar71);
    fVar144 = auVar159._0_4_ * auVar158._0_4_;
    fVar143 = auVar17._0_4_ * fVar67;
    fVar126 = auVar17._4_4_ * fVar67;
    fVar139 = auVar17._8_4_ * fVar67;
    fVar140 = auVar17._12_4_ * fVar67;
    auVar18 = vpermilps_avx(auVar107,0xc9);
    auVar158 = vdpps_avx(auVar18,auVar18,0x7f);
    fVar68 = auVar158._0_4_;
    auVar243 = ZEXT416((uint)fVar68);
    auVar159 = vrsqrtss_avx(auVar243,auVar243);
    fVar95 = auVar159._0_4_;
    auVar17 = vpermilps_avx(auVar285,0xc9);
    auVar159 = vdpps_avx(auVar18,auVar17,0x7f);
    fVar95 = fVar95 * 1.5 + fVar68 * -0.5 * fVar95 * fVar95 * fVar95;
    auVar281._0_4_ = fVar68 * auVar17._0_4_;
    auVar281._4_4_ = fVar68 * auVar17._4_4_;
    auVar281._8_4_ = fVar68 * auVar17._8_4_;
    auVar281._12_4_ = fVar68 * auVar17._12_4_;
    fVar68 = auVar159._0_4_;
    auVar316._0_4_ = fVar68 * auVar18._0_4_;
    auVar316._4_4_ = fVar68 * auVar18._4_4_;
    auVar316._8_4_ = fVar68 * auVar18._8_4_;
    auVar316._12_4_ = fVar68 * auVar18._12_4_;
    auVar17 = vsubps_avx(auVar281,auVar316);
    auVar159 = vrcpss_avx(auVar243,auVar243);
    auVar158 = vfnmadd213ss_fma(auVar158,auVar159,auVar71);
    fVar68 = auVar159._0_4_ * auVar158._0_4_;
    fVar141 = fVar95 * auVar18._0_4_;
    fVar142 = fVar95 * auVar18._4_4_;
    fVar162 = fVar95 * auVar18._8_4_;
    fVar163 = fVar95 * auVar18._12_4_;
    auVar158 = vshufps_avx(auVar152,auVar152,0xff);
    auVar159 = vshufps_avx(auVar22,auVar22,0xff);
    auVar149._0_4_ = auVar159._0_4_ * fVar143;
    auVar149._4_4_ = auVar159._4_4_ * fVar126;
    auVar149._8_4_ = auVar159._8_4_ * fVar139;
    auVar149._12_4_ = auVar159._12_4_ * fVar140;
    auVar110._0_4_ = auVar158._0_4_ * fVar143 + auVar159._0_4_ * fVar67 * auVar16._0_4_ * fVar144;
    auVar110._4_4_ = auVar158._4_4_ * fVar126 + auVar159._4_4_ * fVar67 * auVar16._4_4_ * fVar144;
    auVar110._8_4_ = auVar158._8_4_ * fVar139 + auVar159._8_4_ * fVar67 * auVar16._8_4_ * fVar144;
    auVar110._12_4_ =
         auVar158._12_4_ * fVar140 + auVar159._12_4_ * fVar67 * auVar16._12_4_ * fVar144;
    auVar16 = vsubps_avx(auVar22,auVar149);
    fVar144 = auVar22._0_4_ + auVar149._0_4_;
    fVar143 = auVar22._4_4_ + auVar149._4_4_;
    fVar126 = auVar22._8_4_ + auVar149._8_4_;
    fVar139 = auVar22._12_4_ + auVar149._12_4_;
    auVar18 = vsubps_avx(auVar152,auVar110);
    auVar158 = vshufps_avx(auVar181,auVar181,0xff);
    auVar159 = vshufps_avx(auVar327,auVar327,0xff);
    auVar169._0_4_ = auVar159._0_4_ * fVar141;
    auVar169._4_4_ = auVar159._4_4_ * fVar142;
    auVar169._8_4_ = auVar159._8_4_ * fVar162;
    auVar169._12_4_ = auVar159._12_4_ * fVar163;
    auVar111._0_4_ = auVar159._0_4_ * fVar95 * auVar17._0_4_ * fVar68 + auVar158._0_4_ * fVar141;
    auVar111._4_4_ = auVar159._4_4_ * fVar95 * auVar17._4_4_ * fVar68 + auVar158._4_4_ * fVar142;
    auVar111._8_4_ = auVar159._8_4_ * fVar95 * auVar17._8_4_ * fVar68 + auVar158._8_4_ * fVar162;
    auVar111._12_4_ = auVar159._12_4_ * fVar95 * auVar17._12_4_ * fVar68 + auVar158._12_4_ * fVar163
    ;
    auVar158 = vsubps_avx(auVar327,auVar169);
    auVar170._0_4_ = auVar327._0_4_ + auVar169._0_4_;
    auVar170._4_4_ = auVar327._4_4_ + auVar169._4_4_;
    auVar170._8_4_ = auVar327._8_4_ + auVar169._8_4_;
    auVar170._12_4_ = auVar327._12_4_ + auVar169._12_4_;
    auVar159 = vsubps_avx(auVar181,auVar111);
    local_568._0_4_ = auVar20._0_4_;
    local_568._4_4_ = auVar20._4_4_;
    uStack_560._0_4_ = auVar20._8_4_;
    uStack_560._4_4_ = auVar20._12_4_;
    auVar186._0_4_ = auVar19._0_4_ + (float)local_568._0_4_ * 0.33333334;
    auVar186._4_4_ = auVar19._4_4_ + (float)local_568._4_4_ * 0.33333334;
    auVar186._8_4_ = auVar19._8_4_ + (float)uStack_560 * 0.33333334;
    auVar186._12_4_ = auVar19._12_4_ + uStack_560._4_4_ * 0.33333334;
    fVar67 = 1.0 - fVar96;
    auVar112._4_4_ = fVar67;
    auVar112._0_4_ = fVar67;
    auVar112._8_4_ = fVar67;
    auVar112._12_4_ = fVar67;
    auVar282._0_4_ = fVar96 * auVar16._0_4_;
    auVar282._4_4_ = fVar96 * auVar16._4_4_;
    auVar282._8_4_ = fVar96 * auVar16._8_4_;
    auVar282._12_4_ = fVar96 * auVar16._12_4_;
    local_3c8 = vfmadd231ps_fma(auVar282,auVar112,auVar19);
    auVar129._0_4_ = fVar96 * (auVar16._0_4_ + auVar18._0_4_ * 0.33333334);
    auVar129._4_4_ = fVar96 * (auVar16._4_4_ + auVar18._4_4_ * 0.33333334);
    auVar129._8_4_ = fVar96 * (auVar16._8_4_ + auVar18._8_4_ * 0.33333334);
    auVar129._12_4_ = fVar96 * (auVar16._12_4_ + auVar18._12_4_ * 0.33333334);
    auVar20 = vfmadd231ps_fma(auVar129,auVar112,auVar186);
    local_548 = auVar21._0_4_;
    fStack_544 = auVar21._4_4_;
    fStack_540 = auVar21._8_4_;
    fStack_53c = auVar21._12_4_;
    auVar130._0_4_ = local_548 * 0.33333334;
    auVar130._4_4_ = fStack_544 * 0.33333334;
    auVar130._8_4_ = fStack_540 * 0.33333334;
    auVar130._12_4_ = fStack_53c * 0.33333334;
    auVar16 = vsubps_avx(auVar155,auVar130);
    auVar301._0_4_ = (float)local_5b8._0_4_ + (fVar236 + auVar166._0_4_) * 0.33333334;
    auVar301._4_4_ = (float)local_5b8._4_4_ + (fVar251 + auVar166._4_4_) * 0.33333334;
    auVar301._8_4_ = fStack_5b0 + (fVar265 + auVar166._8_4_) * 0.33333334;
    auVar301._12_4_ = fStack_5ac + (fVar97 + auVar166._12_4_) * 0.33333334;
    auVar204._0_4_ = (fVar312 + auVar167._0_4_) * 0.33333334;
    auVar204._4_4_ = (fVar324 + auVar167._4_4_) * 0.33333334;
    auVar204._8_4_ = (fVar325 + auVar167._8_4_) * 0.33333334;
    auVar204._12_4_ = (fVar326 + auVar167._12_4_) * 0.33333334;
    auVar17 = vsubps_avx(_local_538,auVar204);
    auVar283._0_4_ = auVar159._0_4_ * 0.33333334;
    auVar283._4_4_ = auVar159._4_4_ * 0.33333334;
    auVar283._8_4_ = auVar159._8_4_ * 0.33333334;
    auVar283._12_4_ = auVar159._12_4_ * 0.33333334;
    auVar159 = vsubps_avx(auVar158,auVar283);
    auVar255._0_4_ = (fVar180 + auVar111._0_4_) * 0.33333334;
    auVar255._4_4_ = (fVar200 + auVar111._4_4_) * 0.33333334;
    auVar255._8_4_ = (fVar201 + auVar111._8_4_) * 0.33333334;
    auVar255._12_4_ = (fVar231 + auVar111._12_4_) * 0.33333334;
    auVar18 = vsubps_avx(auVar170,auVar255);
    auVar284._0_4_ = fVar96 * auVar159._0_4_;
    auVar284._4_4_ = fVar96 * auVar159._4_4_;
    auVar284._8_4_ = fVar96 * auVar159._8_4_;
    auVar284._12_4_ = fVar96 * auVar159._12_4_;
    auVar244._0_4_ = fVar96 * auVar158._0_4_;
    auVar244._4_4_ = fVar96 * auVar158._4_4_;
    auVar244._8_4_ = fVar96 * auVar158._8_4_;
    auVar244._12_4_ = fVar96 * auVar158._12_4_;
    local_3d8 = vfmadd231ps_fma(auVar284,auVar112,auVar16);
    auVar21 = vfmadd231ps_fma(auVar244,auVar112,auVar155);
    auVar131._0_4_ = fVar96 * fVar144;
    auVar131._4_4_ = fVar96 * fVar143;
    auVar131._8_4_ = fVar96 * fVar126;
    auVar131._12_4_ = fVar96 * fVar139;
    auVar150._0_4_ = fVar96 * (fVar144 + (fVar232 + auVar110._0_4_) * 0.33333334);
    auVar150._4_4_ = fVar96 * (fVar143 + (fVar233 + auVar110._4_4_) * 0.33333334);
    auVar150._8_4_ = fVar96 * (fVar126 + (fVar234 + auVar110._8_4_) * 0.33333334);
    auVar150._12_4_ = fVar96 * (fVar139 + (fVar235 + auVar110._12_4_) * 0.33333334);
    auVar221._0_4_ = fVar96 * auVar18._0_4_;
    auVar221._4_4_ = fVar96 * auVar18._4_4_;
    auVar221._8_4_ = fVar96 * auVar18._8_4_;
    auVar221._12_4_ = fVar96 * auVar18._12_4_;
    auVar171._0_4_ = fVar96 * auVar170._0_4_;
    auVar171._4_4_ = fVar96 * auVar170._4_4_;
    auVar171._8_4_ = fVar96 * auVar170._8_4_;
    auVar171._12_4_ = fVar96 * auVar170._12_4_;
    _local_3e8 = vfmadd231ps_fma(auVar131,auVar112,_local_5b8);
    _local_3f8 = vfmadd231ps_fma(auVar150,auVar112,auVar301);
    auVar22 = vfmadd231ps_fma(auVar221,auVar112,auVar17);
    auVar327 = vfmadd231ps_fma(auVar171,auVar112,_local_538);
    auVar158 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar158 = vinsertps_avx(auVar158,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    local_3a8 = vsubps_avx(local_3c8,auVar158);
    auVar159 = vshufps_avx(local_3a8,local_3a8,0x55);
    auVar155 = vshufps_avx(local_3a8,local_3a8,0xaa);
    aVar5 = pre->ray_space[k].vy.field_0;
    fVar67 = pre->ray_space[k].vz.field_0.m128[0];
    fVar95 = pre->ray_space[k].vz.field_0.m128[1];
    fVar96 = pre->ray_space[k].vz.field_0.m128[2];
    fVar144 = pre->ray_space[k].vz.field_0.m128[3];
    auVar78._0_4_ = fVar67 * auVar155._0_4_;
    auVar78._4_4_ = fVar95 * auVar155._4_4_;
    auVar78._8_4_ = fVar96 * auVar155._8_4_;
    auVar78._12_4_ = fVar144 * auVar155._12_4_;
    auVar16 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar5,auVar159);
    local_3b8 = vsubps_avx(auVar20,auVar158);
    auVar159 = vshufps_avx(local_3b8,local_3b8,0x55);
    auVar155 = vshufps_avx(local_3b8,local_3b8,0xaa);
    auVar329._0_4_ = fVar67 * auVar155._0_4_;
    auVar329._4_4_ = fVar95 * auVar155._4_4_;
    auVar329._8_4_ = fVar96 * auVar155._8_4_;
    auVar329._12_4_ = fVar144 * auVar155._12_4_;
    auVar155 = vfmadd231ps_fma(auVar329,(undefined1  [16])aVar5,auVar159);
    local_2a8 = vsubps_avx(local_3d8,auVar158);
    auVar159 = vshufps_avx(local_2a8,local_2a8,0xaa);
    auVar302._0_4_ = fVar67 * auVar159._0_4_;
    auVar302._4_4_ = fVar95 * auVar159._4_4_;
    auVar302._8_4_ = fVar96 * auVar159._8_4_;
    auVar302._12_4_ = fVar144 * auVar159._12_4_;
    auVar159 = vshufps_avx(local_2a8,local_2a8,0x55);
    auVar17 = vfmadd231ps_fma(auVar302,(undefined1  [16])aVar5,auVar159);
    local_2b8 = vsubps_avx(auVar21,auVar158);
    auVar159 = vshufps_avx(local_2b8,local_2b8,0xaa);
    auVar317._0_4_ = fVar67 * auVar159._0_4_;
    auVar317._4_4_ = fVar95 * auVar159._4_4_;
    auVar317._8_4_ = fVar96 * auVar159._8_4_;
    auVar317._12_4_ = fVar144 * auVar159._12_4_;
    auVar159 = vshufps_avx(local_2b8,local_2b8,0x55);
    auVar18 = vfmadd231ps_fma(auVar317,(undefined1  [16])aVar5,auVar159);
    local_2c8 = vsubps_avx(_local_3e8,auVar158);
    auVar159 = vshufps_avx(local_2c8,local_2c8,0xaa);
    auVar172._0_4_ = fVar67 * auVar159._0_4_;
    auVar172._4_4_ = fVar95 * auVar159._4_4_;
    auVar172._8_4_ = fVar96 * auVar159._8_4_;
    auVar172._12_4_ = fVar144 * auVar159._12_4_;
    auVar159 = vshufps_avx(local_2c8,local_2c8,0x55);
    auVar19 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar5,auVar159);
    local_2d8 = vsubps_avx(_local_3f8,auVar158);
    auVar159 = vshufps_avx(local_2d8,local_2d8,0xaa);
    auVar222._0_4_ = fVar67 * auVar159._0_4_;
    auVar222._4_4_ = fVar95 * auVar159._4_4_;
    auVar222._8_4_ = fVar96 * auVar159._8_4_;
    auVar222._12_4_ = fVar144 * auVar159._12_4_;
    auVar159 = vshufps_avx(local_2d8,local_2d8,0x55);
    auVar243 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar5,auVar159);
    local_2e8 = vsubps_avx(auVar22,auVar158);
    auVar159 = vshufps_avx(local_2e8,local_2e8,0xaa);
    auVar256._0_4_ = fVar67 * auVar159._0_4_;
    auVar256._4_4_ = fVar95 * auVar159._4_4_;
    auVar256._8_4_ = fVar96 * auVar159._8_4_;
    auVar256._12_4_ = fVar144 * auVar159._12_4_;
    auVar159 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar159 = vfmadd231ps_fma(auVar256,(undefined1  [16])aVar5,auVar159);
    local_2f8 = vsubps_avx(auVar327,auVar158);
    auVar158 = vshufps_avx(local_2f8,local_2f8,0xaa);
    auVar187._0_4_ = fVar67 * auVar158._0_4_;
    auVar187._4_4_ = fVar95 * auVar158._4_4_;
    auVar187._8_4_ = fVar96 * auVar158._8_4_;
    auVar187._12_4_ = fVar144 * auVar158._12_4_;
    auVar158 = vshufps_avx(local_2f8,local_2f8,0x55);
    auVar158 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar5,auVar158);
    auVar205._4_4_ = local_3a8._0_4_;
    auVar205._0_4_ = local_3a8._0_4_;
    auVar205._8_4_ = local_3a8._0_4_;
    auVar205._12_4_ = local_3a8._0_4_;
    aVar5 = pre->ray_space[k].vx.field_0;
    auVar71 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar205);
    auVar206._4_4_ = local_3b8._0_4_;
    auVar206._0_4_ = local_3b8._0_4_;
    auVar206._8_4_ = local_3b8._0_4_;
    auVar206._12_4_ = local_3b8._0_4_;
    auVar72 = vfmadd231ps_fma(auVar155,(undefined1  [16])aVar5,auVar206);
    uVar69 = local_2a8._0_4_;
    auVar207._4_4_ = uVar69;
    auVar207._0_4_ = uVar69;
    auVar207._8_4_ = uVar69;
    auVar207._12_4_ = uVar69;
    auVar291 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar207);
    uVar69 = local_2b8._0_4_;
    auVar208._4_4_ = uVar69;
    auVar208._0_4_ = uVar69;
    auVar208._8_4_ = uVar69;
    auVar208._12_4_ = uVar69;
    auVar70 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar5,auVar208);
    uVar69 = local_2c8._0_4_;
    auVar209._4_4_ = uVar69;
    auVar209._0_4_ = uVar69;
    auVar209._8_4_ = uVar69;
    auVar209._12_4_ = uVar69;
    auVar99 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar5,auVar209);
    uVar69 = local_2d8._0_4_;
    auVar210._4_4_ = uVar69;
    auVar210._0_4_ = uVar69;
    auVar210._8_4_ = uVar69;
    auVar210._12_4_ = uVar69;
    auVar243 = vfmadd231ps_fma(auVar243,(undefined1  [16])aVar5,auVar210);
    uVar69 = local_2e8._0_4_;
    auVar211._4_4_ = uVar69;
    auVar211._0_4_ = uVar69;
    auVar211._8_4_ = uVar69;
    auVar211._12_4_ = uVar69;
    auVar100 = vfmadd231ps_fma(auVar159,(undefined1  [16])aVar5,auVar211);
    uVar69 = local_2f8._0_4_;
    auVar212._4_4_ = uVar69;
    auVar212._0_4_ = uVar69;
    auVar212._8_4_ = uVar69;
    auVar212._12_4_ = uVar69;
    auVar101 = vfmadd231ps_fma(auVar158,(undefined1  [16])aVar5,auVar212);
    auVar16 = vmovlhps_avx(auVar71,auVar99);
    auVar17 = vmovlhps_avx(auVar72,auVar243);
    auVar18 = vmovlhps_avx(auVar291,auVar100);
    auVar19 = vmovlhps_avx(auVar70,auVar101);
    auVar158 = vminps_avx(auVar16,auVar17);
    auVar159 = vminps_avx(auVar18,auVar19);
    auVar155 = vminps_avx(auVar158,auVar159);
    auVar158 = vmaxps_avx(auVar16,auVar17);
    auVar159 = vmaxps_avx(auVar18,auVar19);
    auVar158 = vmaxps_avx(auVar158,auVar159);
    auVar159 = vshufpd_avx(auVar155,auVar155,3);
    auVar155 = vminps_avx(auVar155,auVar159);
    auVar159 = vshufpd_avx(auVar158,auVar158,3);
    auVar159 = vmaxps_avx(auVar158,auVar159);
    auVar158 = vandps_avx(local_398,auVar155);
    auVar159 = vandps_avx(auVar159,local_398);
    auVar158 = vmaxps_avx(auVar158,auVar159);
    auVar159 = vmovshdup_avx(auVar158);
    auVar158 = vmaxss_avx(auVar159,auVar158);
    fVar95 = auVar158._0_4_ * 9.536743e-07;
    auVar245._8_8_ = auVar71._0_8_;
    auVar245._0_8_ = auVar71._0_8_;
    auVar268._8_8_ = auVar72._0_8_;
    auVar268._0_8_ = auVar72._0_8_;
    auVar303._0_8_ = auVar291._0_8_;
    auVar303._8_8_ = auVar303._0_8_;
    auVar318._0_8_ = auVar70._0_8_;
    auVar318._8_8_ = auVar318._0_8_;
    local_268 = fVar95;
    fStack_264 = fVar95;
    fStack_260 = fVar95;
    fStack_25c = fVar95;
    fStack_258 = fVar95;
    fStack_254 = fVar95;
    fStack_250 = fVar95;
    fStack_24c = fVar95;
    local_78 = -fVar95;
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    fStack_68 = local_78;
    fStack_64 = local_78;
    fStack_60 = local_78;
    fStack_5c = local_78;
    local_368 = uVar58;
    uStack_364 = uVar58;
    uStack_360 = uVar58;
    uStack_35c = uVar58;
    local_378 = uVar7;
    uStack_374 = uVar7;
    uStack_370 = uVar7;
    uStack_36c = uVar7;
    uVar66 = 0;
    fVar67 = *(float *)(ray + k * 4 + 0x30);
    local_278 = vsubps_avx(auVar17,auVar16);
    local_288 = vsubps_avx(auVar18,auVar17);
    local_298 = vsubps_avx(auVar19,auVar18);
    local_318 = vsubps_avx(_local_3e8,local_3c8);
    local_328 = vsubps_avx(_local_3f8,auVar20);
    local_338 = vsubps_avx(auVar22,local_3d8);
    _local_348 = vsubps_avx(auVar327,auVar21);
    auVar199 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar289 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_016da636:
    local_308 = auVar289._0_16_;
    auVar188 = auVar199._0_16_;
    auVar158 = vshufps_avx(auVar188,auVar188,0x50);
    auVar330._8_4_ = 0x3f800000;
    auVar330._0_8_ = 0x3f8000003f800000;
    auVar330._12_4_ = 0x3f800000;
    auVar333._16_4_ = 0x3f800000;
    auVar333._0_16_ = auVar330;
    auVar333._20_4_ = 0x3f800000;
    auVar333._24_4_ = 0x3f800000;
    auVar333._28_4_ = 0x3f800000;
    auVar159 = vsubps_avx(auVar330,auVar158);
    fVar96 = auVar158._0_4_;
    fVar142 = auVar99._0_4_;
    auVar79._0_4_ = fVar142 * fVar96;
    fVar144 = auVar158._4_4_;
    fVar162 = auVar99._4_4_;
    auVar79._4_4_ = fVar162 * fVar144;
    fVar68 = auVar158._8_4_;
    auVar79._8_4_ = fVar142 * fVar68;
    fVar143 = auVar158._12_4_;
    auVar79._12_4_ = fVar162 * fVar143;
    fVar163 = auVar243._0_4_;
    auVar213._0_4_ = fVar163 * fVar96;
    fVar180 = auVar243._4_4_;
    auVar213._4_4_ = fVar180 * fVar144;
    auVar213._8_4_ = fVar163 * fVar68;
    auVar213._12_4_ = fVar180 * fVar143;
    fVar200 = auVar100._0_4_;
    auVar173._0_4_ = fVar200 * fVar96;
    fVar201 = auVar100._4_4_;
    auVar173._4_4_ = fVar201 * fVar144;
    auVar173._8_4_ = fVar200 * fVar68;
    auVar173._12_4_ = fVar201 * fVar143;
    fVar251 = auVar101._0_4_;
    auVar132._0_4_ = fVar251 * fVar96;
    fVar265 = auVar101._4_4_;
    auVar132._4_4_ = fVar265 * fVar144;
    auVar132._8_4_ = fVar251 * fVar68;
    auVar132._12_4_ = fVar265 * fVar143;
    auVar72 = vfmadd231ps_fma(auVar79,auVar159,auVar245);
    auVar291 = vfmadd231ps_fma(auVar213,auVar159,auVar268);
    auVar70 = vfmadd231ps_fma(auVar173,auVar159,auVar303);
    auVar107 = vfmadd231ps_fma(auVar132,auVar318,auVar159);
    auVar158 = vmovshdup_avx(auVar289._0_16_);
    fVar96 = auVar289._0_4_;
    fStack_120 = (auVar158._0_4_ - fVar96) * 0.04761905;
    auVar264._4_4_ = fVar96;
    auVar264._0_4_ = fVar96;
    auVar264._8_4_ = fVar96;
    auVar264._12_4_ = fVar96;
    auVar264._16_4_ = fVar96;
    auVar264._20_4_ = fVar96;
    auVar264._24_4_ = fVar96;
    auVar264._28_4_ = fVar96;
    auVar122._0_8_ = auVar158._0_8_;
    auVar122._8_8_ = auVar122._0_8_;
    auVar122._16_8_ = auVar122._0_8_;
    auVar122._24_8_ = auVar122._0_8_;
    auVar92 = vsubps_avx(auVar122,auVar264);
    uVar69 = auVar72._0_4_;
    auVar322._4_4_ = uVar69;
    auVar322._0_4_ = uVar69;
    auVar322._8_4_ = uVar69;
    auVar322._12_4_ = uVar69;
    auVar322._16_4_ = uVar69;
    auVar322._20_4_ = uVar69;
    auVar322._24_4_ = uVar69;
    auVar322._28_4_ = uVar69;
    auVar158 = vmovshdup_avx(auVar72);
    uVar98 = auVar158._0_8_;
    auVar311._8_8_ = uVar98;
    auVar311._0_8_ = uVar98;
    auVar311._16_8_ = uVar98;
    auVar311._24_8_ = uVar98;
    fVar164 = auVar291._0_4_;
    auVar296._4_4_ = fVar164;
    auVar296._0_4_ = fVar164;
    auVar296._8_4_ = fVar164;
    auVar296._12_4_ = fVar164;
    auVar296._16_4_ = fVar164;
    auVar296._20_4_ = fVar164;
    auVar296._24_4_ = fVar164;
    auVar296._28_4_ = fVar164;
    auVar159 = vmovshdup_avx(auVar291);
    auVar123._0_8_ = auVar159._0_8_;
    auVar123._8_8_ = auVar123._0_8_;
    auVar123._16_8_ = auVar123._0_8_;
    auVar123._24_8_ = auVar123._0_8_;
    fVar141 = auVar70._0_4_;
    auVar228._4_4_ = fVar141;
    auVar228._0_4_ = fVar141;
    auVar228._8_4_ = fVar141;
    auVar228._12_4_ = fVar141;
    auVar228._16_4_ = fVar141;
    auVar228._20_4_ = fVar141;
    auVar228._24_4_ = fVar141;
    auVar228._28_4_ = fVar141;
    auVar155 = vmovshdup_avx(auVar70);
    auVar249._0_8_ = auVar155._0_8_;
    auVar249._8_8_ = auVar249._0_8_;
    auVar249._16_8_ = auVar249._0_8_;
    auVar249._24_8_ = auVar249._0_8_;
    fVar140 = auVar107._0_4_;
    auVar71 = vmovshdup_avx(auVar107);
    auVar285 = vfmadd132ps_fma(auVar92,auVar264,_DAT_01faff20);
    auVar92 = vsubps_avx(auVar333,ZEXT1632(auVar285));
    fVar96 = auVar285._0_4_;
    fVar144 = auVar285._4_4_;
    auVar23._4_4_ = fVar164 * fVar144;
    auVar23._0_4_ = fVar164 * fVar96;
    fVar68 = auVar285._8_4_;
    auVar23._8_4_ = fVar164 * fVar68;
    fVar143 = auVar285._12_4_;
    auVar23._12_4_ = fVar164 * fVar143;
    auVar23._16_4_ = fVar164 * 0.0;
    auVar23._20_4_ = fVar164 * 0.0;
    auVar23._24_4_ = fVar164 * 0.0;
    auVar23._28_4_ = 0x3f800000;
    auVar285 = vfmadd231ps_fma(auVar23,auVar92,auVar322);
    fVar126 = auVar159._0_4_;
    fVar139 = auVar159._4_4_;
    auVar24._4_4_ = fVar139 * fVar144;
    auVar24._0_4_ = fVar126 * fVar96;
    auVar24._8_4_ = fVar126 * fVar68;
    auVar24._12_4_ = fVar139 * fVar143;
    auVar24._16_4_ = fVar126 * 0.0;
    auVar24._20_4_ = fVar139 * 0.0;
    auVar24._24_4_ = fVar126 * 0.0;
    auVar24._28_4_ = uVar69;
    auVar127 = vfmadd231ps_fma(auVar24,auVar92,auVar311);
    auVar25._4_4_ = fVar141 * fVar144;
    auVar25._0_4_ = fVar141 * fVar96;
    auVar25._8_4_ = fVar141 * fVar68;
    auVar25._12_4_ = fVar141 * fVar143;
    auVar25._16_4_ = fVar141 * 0.0;
    auVar25._20_4_ = fVar141 * 0.0;
    auVar25._24_4_ = fVar141 * 0.0;
    auVar25._28_4_ = auVar158._4_4_;
    auVar128 = vfmadd231ps_fma(auVar25,auVar92,auVar296);
    fVar126 = auVar155._0_4_;
    fVar139 = auVar155._4_4_;
    auVar15._4_4_ = fVar139 * fVar144;
    auVar15._0_4_ = fVar126 * fVar96;
    auVar15._8_4_ = fVar126 * fVar68;
    auVar15._12_4_ = fVar139 * fVar143;
    auVar15._16_4_ = fVar126 * 0.0;
    auVar15._20_4_ = fVar139 * 0.0;
    auVar15._24_4_ = fVar126 * 0.0;
    auVar15._28_4_ = fVar164;
    auVar152 = vfmadd231ps_fma(auVar15,auVar92,auVar123);
    auVar158 = vshufps_avx(auVar72,auVar72,0xaa);
    uStack_560 = auVar158._0_8_;
    local_568 = (undefined1  [8])uStack_560;
    uStack_558 = uStack_560;
    uStack_550 = uStack_560;
    auVar159 = vshufps_avx(auVar72,auVar72,0xff);
    uStack_600 = auVar159._0_8_;
    local_608 = (undefined1  [8])uStack_600;
    uStack_5f8 = uStack_600;
    uStack_5f0 = uStack_600;
    auVar26._4_4_ = fVar140 * fVar144;
    auVar26._0_4_ = fVar140 * fVar96;
    auVar26._8_4_ = fVar140 * fVar68;
    auVar26._12_4_ = fVar140 * fVar143;
    auVar26._16_4_ = fVar140 * 0.0;
    auVar26._20_4_ = fVar140 * 0.0;
    auVar26._24_4_ = fVar140 * 0.0;
    auVar26._28_4_ = fVar140;
    auVar72 = vfmadd231ps_fma(auVar26,auVar92,auVar228);
    auVar159 = vshufps_avx(auVar291,auVar291,0xaa);
    auVar229._0_8_ = auVar159._0_8_;
    auVar229._8_8_ = auVar229._0_8_;
    auVar229._16_8_ = auVar229._0_8_;
    auVar229._24_8_ = auVar229._0_8_;
    auVar155 = vshufps_avx(auVar291,auVar291,0xff);
    local_518._8_8_ = auVar155._0_8_;
    local_518._0_8_ = local_518._8_8_;
    local_518._16_8_ = local_518._8_8_;
    local_518._24_8_ = local_518._8_8_;
    fVar126 = auVar71._0_4_;
    fVar139 = auVar71._4_4_;
    auVar27._4_4_ = fVar139 * fVar144;
    auVar27._0_4_ = fVar126 * fVar96;
    auVar27._8_4_ = fVar126 * fVar68;
    auVar27._12_4_ = fVar139 * fVar143;
    auVar27._16_4_ = fVar126 * 0.0;
    auVar27._20_4_ = fVar139 * 0.0;
    auVar27._24_4_ = fVar126 * 0.0;
    auVar27._28_4_ = auVar158._4_4_;
    auVar181 = vfmadd231ps_fma(auVar27,auVar92,auVar249);
    auVar28._28_4_ = fVar139;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar128._12_4_ * fVar143,
                            CONCAT48(auVar128._8_4_ * fVar68,
                                     CONCAT44(auVar128._4_4_ * fVar144,auVar128._0_4_ * fVar96))));
    auVar285 = vfmadd231ps_fma(auVar28,auVar92,ZEXT1632(auVar285));
    fVar126 = auVar155._4_4_;
    auVar29._28_4_ = fVar126;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar152._12_4_ * fVar143,
                            CONCAT48(auVar152._8_4_ * fVar68,
                                     CONCAT44(auVar152._4_4_ * fVar144,auVar152._0_4_ * fVar96))));
    auVar127 = vfmadd231ps_fma(auVar29,auVar92,ZEXT1632(auVar127));
    auVar158 = vshufps_avx(auVar70,auVar70,0xaa);
    uVar98 = auVar158._0_8_;
    auVar217._8_8_ = uVar98;
    auVar217._0_8_ = uVar98;
    auVar217._16_8_ = uVar98;
    auVar217._24_8_ = uVar98;
    auVar71 = vshufps_avx(auVar70,auVar70,0xff);
    uVar98 = auVar71._0_8_;
    auVar334._8_8_ = uVar98;
    auVar334._0_8_ = uVar98;
    auVar334._16_8_ = uVar98;
    auVar334._24_8_ = uVar98;
    auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar72._12_4_ * fVar143,
                                                 CONCAT48(auVar72._8_4_ * fVar68,
                                                          CONCAT44(auVar72._4_4_ * fVar144,
                                                                   auVar72._0_4_ * fVar96)))),
                              auVar92,ZEXT1632(auVar128));
    auVar72 = vshufps_avx(auVar107,auVar107,0xaa);
    auVar291 = vshufps_avx(auVar107,auVar107,0xff);
    auVar107 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar181._12_4_,
                                                  CONCAT48(fVar68 * auVar181._8_4_,
                                                           CONCAT44(fVar144 * auVar181._4_4_,
                                                                    fVar96 * auVar181._0_4_)))),
                               auVar92,ZEXT1632(auVar152));
    auVar128 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar70._12_4_,
                                                  CONCAT48(fVar68 * auVar70._8_4_,
                                                           CONCAT44(fVar144 * auVar70._4_4_,
                                                                    fVar96 * auVar70._0_4_)))),
                               auVar92,ZEXT1632(auVar285));
    auVar23 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar285));
    auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar107._12_4_,
                                                 CONCAT48(fVar68 * auVar107._8_4_,
                                                          CONCAT44(fVar144 * auVar107._4_4_,
                                                                   fVar96 * auVar107._0_4_)))),
                              auVar92,ZEXT1632(auVar127));
    auVar24 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar127));
    fStack_46c = auVar24._28_4_;
    auVar297._0_4_ = fStack_120 * auVar23._0_4_ * 3.0;
    auVar297._4_4_ = fStack_120 * auVar23._4_4_ * 3.0;
    auVar297._8_4_ = fStack_120 * auVar23._8_4_ * 3.0;
    auVar297._12_4_ = fStack_120 * auVar23._12_4_ * 3.0;
    auVar297._16_4_ = fStack_120 * auVar23._16_4_ * 3.0;
    auVar297._20_4_ = fStack_120 * auVar23._20_4_ * 3.0;
    auVar297._24_4_ = fStack_120 * auVar23._24_4_ * 3.0;
    auVar297._28_4_ = 0;
    local_488._0_4_ = fStack_120 * auVar24._0_4_ * 3.0;
    local_488._4_4_ = fStack_120 * auVar24._4_4_ * 3.0;
    fStack_480 = fStack_120 * auVar24._8_4_ * 3.0;
    fStack_47c = fStack_120 * auVar24._12_4_ * 3.0;
    fStack_478 = fStack_120 * auVar24._16_4_ * 3.0;
    fStack_474 = fStack_120 * auVar24._20_4_ * 3.0;
    fStack_470 = fStack_120 * auVar24._24_4_ * 3.0;
    fVar139 = auVar159._0_4_;
    fVar140 = auVar159._4_4_;
    auVar298._4_4_ = fVar140 * fVar144;
    auVar298._0_4_ = fVar139 * fVar96;
    auVar298._8_4_ = fVar139 * fVar68;
    auVar298._12_4_ = fVar140 * fVar143;
    auVar298._16_4_ = fVar139 * 0.0;
    auVar298._20_4_ = fVar140 * 0.0;
    auVar298._24_4_ = fVar139 * 0.0;
    auVar298._28_4_ = fStack_46c;
    auVar159 = vfmadd231ps_fma(auVar298,auVar92,_local_568);
    fVar139 = auVar155._0_4_;
    auVar31._4_4_ = fVar126 * fVar144;
    auVar31._0_4_ = fVar139 * fVar96;
    auVar31._8_4_ = fVar139 * fVar68;
    auVar31._12_4_ = fVar126 * fVar143;
    auVar31._16_4_ = fVar139 * 0.0;
    auVar31._20_4_ = fVar126 * 0.0;
    auVar31._24_4_ = fVar139 * 0.0;
    auVar31._28_4_ = 0;
    auVar155 = vfmadd231ps_fma(auVar31,auVar92,_local_608);
    fVar126 = auVar158._0_4_;
    fVar139 = auVar158._4_4_;
    auVar32._4_4_ = fVar139 * fVar144;
    auVar32._0_4_ = fVar126 * fVar96;
    auVar32._8_4_ = fVar126 * fVar68;
    auVar32._12_4_ = fVar139 * fVar143;
    auVar32._16_4_ = fVar126 * 0.0;
    auVar32._20_4_ = fVar139 * 0.0;
    auVar32._24_4_ = fVar126 * 0.0;
    auVar32._28_4_ = auVar23._28_4_;
    auVar158 = vfmadd231ps_fma(auVar32,auVar92,auVar229);
    fVar126 = auVar71._0_4_;
    fVar141 = auVar71._4_4_;
    auVar33._4_4_ = fVar141 * fVar144;
    auVar33._0_4_ = fVar126 * fVar96;
    auVar33._8_4_ = fVar126 * fVar68;
    auVar33._12_4_ = fVar141 * fVar143;
    auVar33._16_4_ = fVar126 * 0.0;
    auVar33._20_4_ = fVar141 * 0.0;
    auVar33._24_4_ = fVar126 * 0.0;
    auVar33._28_4_ = fVar140;
    auVar71 = vfmadd231ps_fma(auVar33,auVar92,local_518);
    auVar26 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar128));
    fVar126 = auVar72._0_4_;
    fVar139 = auVar72._4_4_;
    auVar34._4_4_ = fVar139 * fVar144;
    auVar34._0_4_ = fVar126 * fVar96;
    auVar34._8_4_ = fVar126 * fVar68;
    auVar34._12_4_ = fVar139 * fVar143;
    auVar34._16_4_ = fVar126 * 0.0;
    auVar34._20_4_ = fVar139 * 0.0;
    auVar34._24_4_ = fVar126 * 0.0;
    auVar34._28_4_ = fVar139;
    auVar72 = vfmadd231ps_fma(auVar34,auVar92,auVar217);
    auVar27 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar70));
    fVar126 = auVar291._0_4_;
    fVar139 = auVar291._4_4_;
    auVar35._4_4_ = fVar139 * fVar144;
    auVar35._0_4_ = fVar126 * fVar96;
    auVar35._8_4_ = fVar126 * fVar68;
    auVar35._12_4_ = fVar139 * fVar143;
    auVar35._16_4_ = fVar126 * 0.0;
    auVar35._20_4_ = fVar139 * 0.0;
    auVar35._24_4_ = fVar126 * 0.0;
    auVar35._28_4_ = fVar139;
    auVar291 = vfmadd231ps_fma(auVar35,auVar92,auVar334);
    auVar36._28_4_ = fVar141;
    auVar36._0_28_ =
         ZEXT1628(CONCAT412(auVar158._12_4_ * fVar143,
                            CONCAT48(auVar158._8_4_ * fVar68,
                                     CONCAT44(auVar158._4_4_ * fVar144,auVar158._0_4_ * fVar96))));
    auVar159 = vfmadd231ps_fma(auVar36,auVar92,ZEXT1632(auVar159));
    auVar155 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar71._12_4_,
                                                  CONCAT48(fVar68 * auVar71._8_4_,
                                                           CONCAT44(fVar144 * auVar71._4_4_,
                                                                    fVar96 * auVar71._0_4_)))),
                               auVar92,ZEXT1632(auVar155));
    auVar124._0_4_ = auVar128._0_4_ + auVar297._0_4_;
    auVar124._4_4_ = auVar128._4_4_ + auVar297._4_4_;
    auVar124._8_4_ = auVar128._8_4_ + auVar297._8_4_;
    auVar124._12_4_ = auVar128._12_4_ + auVar297._12_4_;
    auVar124._16_4_ = auVar297._16_4_ + 0.0;
    auVar124._20_4_ = auVar297._20_4_ + 0.0;
    auVar124._24_4_ = auVar297._24_4_ + 0.0;
    auVar124._28_4_ = 0;
    auVar158 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar72._12_4_ * fVar143,
                                                  CONCAT48(auVar72._8_4_ * fVar68,
                                                           CONCAT44(auVar72._4_4_ * fVar144,
                                                                    auVar72._0_4_ * fVar96)))),
                               auVar92,ZEXT1632(auVar158));
    auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar291._12_4_ * fVar143,
                                                 CONCAT48(auVar291._8_4_ * fVar68,
                                                          CONCAT44(auVar291._4_4_ * fVar144,
                                                                   auVar291._0_4_ * fVar96)))),
                              auVar92,ZEXT1632(auVar71));
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar158._12_4_,
                                                 CONCAT48(fVar68 * auVar158._8_4_,
                                                          CONCAT44(fVar144 * auVar158._4_4_,
                                                                   fVar96 * auVar158._0_4_)))),
                              auVar92,ZEXT1632(auVar159));
    auVar291 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar71._12_4_ * fVar143,
                                                  CONCAT48(auVar71._8_4_ * fVar68,
                                                           CONCAT44(auVar71._4_4_ * fVar144,
                                                                    auVar71._0_4_ * fVar96)))),
                               ZEXT1632(auVar155),auVar92);
    auVar92 = vsubps_avx(ZEXT1632(auVar158),ZEXT1632(auVar159));
    auVar23 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar155));
    auVar323._0_4_ = fStack_120 * auVar92._0_4_ * 3.0;
    auVar323._4_4_ = fStack_120 * auVar92._4_4_ * 3.0;
    auVar323._8_4_ = fStack_120 * auVar92._8_4_ * 3.0;
    auVar323._12_4_ = fStack_120 * auVar92._12_4_ * 3.0;
    auVar323._16_4_ = fStack_120 * auVar92._16_4_ * 3.0;
    auVar323._20_4_ = fStack_120 * auVar92._20_4_ * 3.0;
    auVar323._24_4_ = fStack_120 * auVar92._24_4_ * 3.0;
    auVar323._28_4_ = 0;
    local_138 = fStack_120 * auVar23._0_4_ * 3.0;
    fStack_134 = fStack_120 * auVar23._4_4_ * 3.0;
    auVar37._4_4_ = fStack_134;
    auVar37._0_4_ = local_138;
    fStack_130 = fStack_120 * auVar23._8_4_ * 3.0;
    auVar37._8_4_ = fStack_130;
    fStack_12c = fStack_120 * auVar23._12_4_ * 3.0;
    auVar37._12_4_ = fStack_12c;
    fStack_128 = fStack_120 * auVar23._16_4_ * 3.0;
    auVar37._16_4_ = fStack_128;
    fStack_124 = fStack_120 * auVar23._20_4_ * 3.0;
    auVar37._20_4_ = fStack_124;
    fStack_120 = fStack_120 * auVar23._24_4_ * 3.0;
    auVar37._24_4_ = fStack_120;
    auVar37._28_4_ = 0x40400000;
    auVar28 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar72));
    _local_448 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar291));
    auVar92 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar128));
    auVar23 = vsubps_avx(ZEXT1632(auVar291),ZEXT1632(auVar70));
    auVar24 = vsubps_avx(auVar28,auVar26);
    fVar164 = auVar92._0_4_ + auVar24._0_4_;
    fVar231 = auVar92._4_4_ + auVar24._4_4_;
    fVar232 = auVar92._8_4_ + auVar24._8_4_;
    fVar233 = auVar92._12_4_ + auVar24._12_4_;
    fVar234 = auVar92._16_4_ + auVar24._16_4_;
    fVar235 = auVar92._20_4_ + auVar24._20_4_;
    fVar236 = auVar92._24_4_ + auVar24._24_4_;
    auVar25 = vsubps_avx(_local_448,auVar27);
    auVar93._0_4_ = auVar23._0_4_ + auVar25._0_4_;
    auVar93._4_4_ = auVar23._4_4_ + auVar25._4_4_;
    auVar93._8_4_ = auVar23._8_4_ + auVar25._8_4_;
    auVar93._12_4_ = auVar23._12_4_ + auVar25._12_4_;
    auVar93._16_4_ = auVar23._16_4_ + auVar25._16_4_;
    auVar93._20_4_ = auVar23._20_4_ + auVar25._20_4_;
    auVar93._24_4_ = auVar23._24_4_ + auVar25._24_4_;
    auVar93._28_4_ = auVar23._28_4_ + auVar25._28_4_;
    local_d8 = ZEXT1632(auVar70);
    fVar96 = auVar70._0_4_;
    local_158 = (float)local_488._0_4_ + fVar96;
    fVar144 = auVar70._4_4_;
    fStack_154 = (float)local_488._4_4_ + fVar144;
    fVar68 = auVar70._8_4_;
    fStack_150 = fStack_480 + fVar68;
    fVar143 = auVar70._12_4_;
    fStack_14c = fStack_47c + fVar143;
    fStack_148 = fStack_478 + 0.0;
    fStack_144 = fStack_474 + 0.0;
    fStack_140 = fStack_470 + 0.0;
    local_98 = ZEXT1632(auVar128);
    auVar23 = vsubps_avx(local_98,auVar297);
    local_b8 = vpermps_avx2(_DAT_01fec480,auVar23);
    auVar23 = vsubps_avx(local_d8,_local_488);
    local_178 = vpermps_avx2(_DAT_01fec480,auVar23);
    local_f8._0_4_ = auVar72._0_4_ + auVar323._0_4_;
    local_f8._4_4_ = auVar72._4_4_ + auVar323._4_4_;
    local_f8._8_4_ = auVar72._8_4_ + auVar323._8_4_;
    local_f8._12_4_ = auVar72._12_4_ + auVar323._12_4_;
    local_f8._16_4_ = auVar323._16_4_ + 0.0;
    local_f8._20_4_ = auVar323._20_4_ + 0.0;
    local_f8._24_4_ = auVar323._24_4_ + 0.0;
    local_f8._28_4_ = 0;
    auVar298 = ZEXT1632(auVar72);
    auVar23 = vsubps_avx(auVar298,auVar323);
    auVar29 = vpermps_avx2(_DAT_01fec480,auVar23);
    fVar126 = auVar291._0_4_;
    local_138 = fVar126 + local_138;
    fVar139 = auVar291._4_4_;
    fStack_134 = fVar139 + fStack_134;
    fVar140 = auVar291._8_4_;
    fStack_130 = fVar140 + fStack_130;
    fVar141 = auVar291._12_4_;
    fStack_12c = fVar141 + fStack_12c;
    fStack_128 = fStack_128 + 0.0;
    fStack_124 = fStack_124 + 0.0;
    fStack_120 = fStack_120 + 0.0;
    auVar23 = vsubps_avx(ZEXT1632(auVar291),auVar37);
    local_118 = vpermps_avx2(_DAT_01fec480,auVar23);
    auVar38._4_4_ = fVar144 * fVar231;
    auVar38._0_4_ = fVar96 * fVar164;
    auVar38._8_4_ = fVar68 * fVar232;
    auVar38._12_4_ = fVar143 * fVar233;
    auVar38._16_4_ = fVar234 * 0.0;
    auVar38._20_4_ = fVar235 * 0.0;
    auVar38._24_4_ = fVar236 * 0.0;
    auVar38._28_4_ = auVar23._28_4_;
    auVar158 = vfnmadd231ps_fma(auVar38,local_98,auVar93);
    fStack_13c = fStack_46c + 0.0;
    auVar39._4_4_ = fStack_154 * fVar231;
    auVar39._0_4_ = local_158 * fVar164;
    auVar39._8_4_ = fStack_150 * fVar232;
    auVar39._12_4_ = fStack_14c * fVar233;
    auVar39._16_4_ = fStack_148 * fVar234;
    auVar39._20_4_ = fStack_144 * fVar235;
    auVar39._24_4_ = fStack_140 * fVar236;
    auVar39._28_4_ = 0;
    auVar159 = vfnmadd231ps_fma(auVar39,auVar93,auVar124);
    auVar40._4_4_ = local_178._4_4_ * fVar231;
    auVar40._0_4_ = local_178._0_4_ * fVar164;
    auVar40._8_4_ = local_178._8_4_ * fVar232;
    auVar40._12_4_ = local_178._12_4_ * fVar233;
    auVar40._16_4_ = local_178._16_4_ * fVar234;
    auVar40._20_4_ = local_178._20_4_ * fVar235;
    auVar40._24_4_ = local_178._24_4_ * fVar236;
    auVar40._28_4_ = fStack_46c + 0.0;
    auVar155 = vfnmadd231ps_fma(auVar40,local_b8,auVar93);
    local_608._0_4_ = auVar27._0_4_;
    local_608._4_4_ = auVar27._4_4_;
    uStack_600._0_4_ = auVar27._8_4_;
    uStack_600._4_4_ = auVar27._12_4_;
    uStack_5f8._0_4_ = auVar27._16_4_;
    uStack_5f8._4_4_ = auVar27._20_4_;
    uStack_5f0._0_4_ = auVar27._24_4_;
    uStack_5f0._4_4_ = auVar27._28_4_;
    auVar41._4_4_ = (float)local_608._4_4_ * fVar231;
    auVar41._0_4_ = (float)local_608._0_4_ * fVar164;
    auVar41._8_4_ = (float)uStack_600 * fVar232;
    auVar41._12_4_ = uStack_600._4_4_ * fVar233;
    auVar41._16_4_ = (float)uStack_5f8 * fVar234;
    auVar41._20_4_ = uStack_5f8._4_4_ * fVar235;
    auVar41._24_4_ = (float)uStack_5f0 * fVar236;
    auVar41._28_4_ = uStack_5f0._4_4_;
    auVar71 = vfnmadd231ps_fma(auVar41,auVar26,auVar93);
    auVar250._0_4_ = fVar126 * fVar164;
    auVar250._4_4_ = fVar139 * fVar231;
    auVar250._8_4_ = fVar140 * fVar232;
    auVar250._12_4_ = fVar141 * fVar233;
    auVar250._16_4_ = fVar234 * 0.0;
    auVar250._20_4_ = fVar235 * 0.0;
    auVar250._24_4_ = fVar236 * 0.0;
    auVar250._28_4_ = 0;
    auVar72 = vfnmadd231ps_fma(auVar250,auVar298,auVar93);
    uStack_11c = 0x40400000;
    auVar42._4_4_ = fStack_134 * fVar231;
    auVar42._0_4_ = local_138 * fVar164;
    auVar42._8_4_ = fStack_130 * fVar232;
    auVar42._12_4_ = fStack_12c * fVar233;
    auVar42._16_4_ = fStack_128 * fVar234;
    auVar42._20_4_ = fStack_124 * fVar235;
    auVar42._24_4_ = fStack_120 * fVar236;
    auVar42._28_4_ = auVar26._28_4_;
    auVar70 = vfnmadd231ps_fma(auVar42,local_f8,auVar93);
    auVar43._4_4_ = local_118._4_4_ * fVar231;
    auVar43._0_4_ = local_118._0_4_ * fVar164;
    auVar43._8_4_ = local_118._8_4_ * fVar232;
    auVar43._12_4_ = local_118._12_4_ * fVar233;
    auVar43._16_4_ = local_118._16_4_ * fVar234;
    auVar43._20_4_ = local_118._20_4_ * fVar235;
    auVar43._24_4_ = local_118._24_4_ * fVar236;
    auVar43._28_4_ = local_118._28_4_;
    auVar107 = vfnmadd231ps_fma(auVar43,auVar29,auVar93);
    auVar44._4_4_ = local_448._4_4_ * fVar231;
    auVar44._0_4_ = local_448._0_4_ * fVar164;
    auVar44._8_4_ = local_448._8_4_ * fVar232;
    auVar44._12_4_ = local_448._12_4_ * fVar233;
    auVar44._16_4_ = local_448._16_4_ * fVar234;
    auVar44._20_4_ = local_448._20_4_ * fVar235;
    auVar44._24_4_ = local_448._24_4_ * fVar236;
    auVar44._28_4_ = auVar92._28_4_ + auVar24._28_4_;
    auVar285 = vfnmadd231ps_fma(auVar44,auVar28,auVar93);
    auVar23 = vminps_avx(ZEXT1632(auVar158),ZEXT1632(auVar159));
    auVar92 = vmaxps_avx(ZEXT1632(auVar158),ZEXT1632(auVar159));
    auVar24 = vminps_avx(ZEXT1632(auVar155),ZEXT1632(auVar71));
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(ZEXT1632(auVar155),ZEXT1632(auVar71));
    auVar92 = vmaxps_avx(auVar92,auVar23);
    auVar25 = vminps_avx(ZEXT1632(auVar72),ZEXT1632(auVar70));
    auVar23 = vmaxps_avx(ZEXT1632(auVar72),ZEXT1632(auVar70));
    auVar15 = vminps_avx(ZEXT1632(auVar107),ZEXT1632(auVar285));
    auVar25 = vminps_avx(auVar25,auVar15);
    auVar25 = vminps_avx(auVar24,auVar25);
    auVar24 = vmaxps_avx(ZEXT1632(auVar107),ZEXT1632(auVar285));
    auVar23 = vmaxps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar92,auVar23);
    auVar52._4_4_ = fStack_264;
    auVar52._0_4_ = local_268;
    auVar52._8_4_ = fStack_260;
    auVar52._12_4_ = fStack_25c;
    auVar52._16_4_ = fStack_258;
    auVar52._20_4_ = fStack_254;
    auVar52._24_4_ = fStack_250;
    auVar52._28_4_ = fStack_24c;
    auVar92 = vcmpps_avx(auVar25,auVar52,2);
    auVar54._4_4_ = fStack_74;
    auVar54._0_4_ = local_78;
    auVar54._8_4_ = fStack_70;
    auVar54._12_4_ = fStack_6c;
    auVar54._16_4_ = fStack_68;
    auVar54._20_4_ = fStack_64;
    auVar54._24_4_ = fStack_60;
    auVar54._28_4_ = fStack_5c;
    auVar23 = vcmpps_avx(auVar23,auVar54,5);
    auVar92 = vandps_avx(auVar23,auVar92);
    auVar23 = local_198 & auVar92;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar23 = vsubps_avx(auVar26,local_98);
      auVar24 = vsubps_avx(auVar28,auVar298);
      fVar231 = auVar23._0_4_ + auVar24._0_4_;
      fVar232 = auVar23._4_4_ + auVar24._4_4_;
      fVar233 = auVar23._8_4_ + auVar24._8_4_;
      fVar234 = auVar23._12_4_ + auVar24._12_4_;
      fVar235 = auVar23._16_4_ + auVar24._16_4_;
      fVar236 = auVar23._20_4_ + auVar24._20_4_;
      fVar97 = auVar23._24_4_ + auVar24._24_4_;
      auVar25 = vsubps_avx(auVar27,local_d8);
      auVar15 = vsubps_avx(_local_448,ZEXT1632(auVar291));
      auVar125._0_4_ = auVar25._0_4_ + auVar15._0_4_;
      auVar125._4_4_ = auVar25._4_4_ + auVar15._4_4_;
      auVar125._8_4_ = auVar25._8_4_ + auVar15._8_4_;
      auVar125._12_4_ = auVar25._12_4_ + auVar15._12_4_;
      auVar125._16_4_ = auVar25._16_4_ + auVar15._16_4_;
      auVar125._20_4_ = auVar25._20_4_ + auVar15._20_4_;
      auVar125._24_4_ = auVar25._24_4_ + auVar15._24_4_;
      fVar164 = auVar15._28_4_;
      auVar125._28_4_ = auVar25._28_4_ + fVar164;
      auVar45._4_4_ = fVar144 * fVar232;
      auVar45._0_4_ = fVar96 * fVar231;
      auVar45._8_4_ = fVar68 * fVar233;
      auVar45._12_4_ = fVar143 * fVar234;
      auVar45._16_4_ = fVar235 * 0.0;
      auVar45._20_4_ = fVar236 * 0.0;
      auVar45._24_4_ = fVar97 * 0.0;
      auVar45._28_4_ = auVar28._28_4_;
      auVar72 = vfnmadd231ps_fma(auVar45,auVar125,local_98);
      auVar46._4_4_ = fVar232 * fStack_154;
      auVar46._0_4_ = fVar231 * local_158;
      auVar46._8_4_ = fVar233 * fStack_150;
      auVar46._12_4_ = fVar234 * fStack_14c;
      auVar46._16_4_ = fVar235 * fStack_148;
      auVar46._20_4_ = fVar236 * fStack_144;
      auVar46._24_4_ = fVar97 * fStack_140;
      auVar46._28_4_ = 0;
      auVar158 = vfnmadd213ps_fma(auVar124,auVar125,auVar46);
      auVar47._4_4_ = fVar232 * local_178._4_4_;
      auVar47._0_4_ = fVar231 * local_178._0_4_;
      auVar47._8_4_ = fVar233 * local_178._8_4_;
      auVar47._12_4_ = fVar234 * local_178._12_4_;
      auVar47._16_4_ = fVar235 * local_178._16_4_;
      auVar47._20_4_ = fVar236 * local_178._20_4_;
      auVar47._24_4_ = fVar97 * local_178._24_4_;
      auVar47._28_4_ = 0;
      auVar159 = vfnmadd213ps_fma(local_b8,auVar125,auVar47);
      auVar48._4_4_ = (float)local_608._4_4_ * fVar232;
      auVar48._0_4_ = (float)local_608._0_4_ * fVar231;
      auVar48._8_4_ = (float)uStack_600 * fVar233;
      auVar48._12_4_ = uStack_600._4_4_ * fVar234;
      auVar48._16_4_ = (float)uStack_5f8 * fVar235;
      auVar48._20_4_ = uStack_5f8._4_4_ * fVar236;
      auVar48._24_4_ = (float)uStack_5f0 * fVar97;
      auVar48._28_4_ = 0;
      auVar291 = vfnmadd231ps_fma(auVar48,auVar125,auVar26);
      auVar160._0_4_ = fVar126 * fVar231;
      auVar160._4_4_ = fVar139 * fVar232;
      auVar160._8_4_ = fVar140 * fVar233;
      auVar160._12_4_ = fVar141 * fVar234;
      auVar160._16_4_ = fVar235 * 0.0;
      auVar160._20_4_ = fVar236 * 0.0;
      auVar160._24_4_ = fVar97 * 0.0;
      auVar160._28_4_ = 0;
      auVar70 = vfnmadd231ps_fma(auVar160,auVar125,auVar298);
      auVar49._4_4_ = fVar232 * fStack_134;
      auVar49._0_4_ = fVar231 * local_138;
      auVar49._8_4_ = fVar233 * fStack_130;
      auVar49._12_4_ = fVar234 * fStack_12c;
      auVar49._16_4_ = fVar235 * fStack_128;
      auVar49._20_4_ = fVar236 * fStack_124;
      auVar49._24_4_ = fVar97 * fStack_120;
      auVar49._28_4_ = fVar164;
      auVar155 = vfnmadd213ps_fma(local_f8,auVar125,auVar49);
      auVar50._4_4_ = fVar232 * local_118._4_4_;
      auVar50._0_4_ = fVar231 * local_118._0_4_;
      auVar50._8_4_ = fVar233 * local_118._8_4_;
      auVar50._12_4_ = fVar234 * local_118._12_4_;
      auVar50._16_4_ = fVar235 * local_118._16_4_;
      auVar50._20_4_ = fVar236 * local_118._20_4_;
      auVar50._24_4_ = fVar97 * local_118._24_4_;
      auVar50._28_4_ = fVar164;
      auVar71 = vfnmadd213ps_fma(auVar29,auVar125,auVar50);
      auVar51._4_4_ = fVar232 * local_448._4_4_;
      auVar51._0_4_ = fVar231 * local_448._0_4_;
      auVar51._8_4_ = fVar233 * local_448._8_4_;
      auVar51._12_4_ = fVar234 * local_448._12_4_;
      auVar51._16_4_ = fVar235 * local_448._16_4_;
      auVar51._20_4_ = fVar236 * local_448._20_4_;
      auVar51._24_4_ = fVar97 * local_448._24_4_;
      auVar51._28_4_ = auVar23._28_4_ + auVar24._28_4_;
      auVar107 = vfnmadd231ps_fma(auVar51,auVar125,auVar28);
      auVar24 = vminps_avx(ZEXT1632(auVar72),ZEXT1632(auVar158));
      auVar23 = vmaxps_avx(ZEXT1632(auVar72),ZEXT1632(auVar158));
      auVar25 = vminps_avx(ZEXT1632(auVar159),ZEXT1632(auVar291));
      auVar25 = vminps_avx(auVar24,auVar25);
      auVar24 = vmaxps_avx(ZEXT1632(auVar159),ZEXT1632(auVar291));
      auVar23 = vmaxps_avx(auVar23,auVar24);
      auVar15 = vminps_avx(ZEXT1632(auVar70),ZEXT1632(auVar155));
      auVar24 = vmaxps_avx(ZEXT1632(auVar70),ZEXT1632(auVar155));
      auVar26 = vminps_avx(ZEXT1632(auVar71),ZEXT1632(auVar107));
      auVar15 = vminps_avx(auVar15,auVar26);
      auVar15 = vminps_avx(auVar25,auVar15);
      auVar25 = vmaxps_avx(ZEXT1632(auVar71),ZEXT1632(auVar107));
      auVar24 = vmaxps_avx(auVar24,auVar25);
      auVar24 = vmaxps_avx(auVar23,auVar24);
      auVar53._4_4_ = fStack_264;
      auVar53._0_4_ = local_268;
      auVar53._8_4_ = fStack_260;
      auVar53._12_4_ = fStack_25c;
      auVar53._16_4_ = fStack_258;
      auVar53._20_4_ = fStack_254;
      auVar53._24_4_ = fStack_250;
      auVar53._28_4_ = fStack_24c;
      auVar23 = vcmpps_avx(auVar15,auVar53,2);
      auVar24 = vcmpps_avx(auVar24,auVar54,5);
      auVar23 = vandps_avx(auVar24,auVar23);
      auVar92 = vandps_avx(auVar92,local_198);
      auVar24 = auVar92 & auVar23;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0x7f,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0xbf,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar24[0x1f] < '\0') {
        auVar92 = vandps_avx(auVar23,auVar92);
        uVar64 = vmovmskps_avx(auVar92);
        if (uVar64 != 0) {
          uVar60 = (ulong)uVar66;
          auStack_388[uVar60] = uVar64 & 0xff;
          uVar98 = vmovlps_avx(local_308);
          *(undefined8 *)(&uStack_248 + uVar60 * 2) = uVar98;
          uVar59 = vmovlps_avx(auVar188);
          auStack_58[uVar60] = uVar59;
          uVar66 = uVar66 + 1;
        }
      }
    }
    if (uVar66 != 0) {
      do {
        uVar60 = (ulong)(uVar66 - 1);
        uVar63 = auStack_388[uVar60];
        uVar64 = (&uStack_248)[uVar60 * 2];
        fVar96 = afStack_244[uVar60 * 2];
        iVar30 = 0;
        for (uVar59 = (ulong)uVar63; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
          iVar30 = iVar30 + 1;
        }
        uVar63 = uVar63 - 1 & uVar63;
        if (uVar63 == 0) {
          uVar66 = uVar66 - 1;
        }
        auVar189._8_8_ = 0;
        auVar189._0_8_ = auStack_58[uVar60];
        auVar199 = ZEXT1664(auVar189);
        auStack_388[uVar60] = uVar63;
        fVar144 = (float)(iVar30 + 1) * 0.14285715;
        auVar158 = vfmadd231ss_fma(ZEXT416((uint)(fVar96 * (float)iVar30 * 0.14285715)),
                                   ZEXT416(uVar64),ZEXT416((uint)(1.0 - (float)iVar30 * 0.14285715))
                                  );
        auVar159 = vfmadd231ss_fma(ZEXT416((uint)(fVar96 * fVar144)),ZEXT416(uVar64),
                                   ZEXT416((uint)(1.0 - fVar144)));
        fVar144 = auVar159._0_4_;
        fVar68 = auVar158._0_4_;
        fVar96 = fVar144 - fVar68;
        if (0.16666667 <= fVar96) {
          auVar158 = vinsertps_avx(auVar158,auVar159,0x10);
          auVar289 = ZEXT1664(auVar158);
          goto LAB_016da636;
        }
        auVar155 = vshufps_avx(auVar189,auVar189,0x50);
        auVar113._8_4_ = 0x3f800000;
        auVar113._0_8_ = 0x3f8000003f800000;
        auVar113._12_4_ = 0x3f800000;
        auVar71 = vsubps_avx(auVar113,auVar155);
        fVar143 = auVar155._0_4_;
        auVar174._0_4_ = fVar143 * fVar142;
        fVar126 = auVar155._4_4_;
        auVar174._4_4_ = fVar126 * fVar162;
        fVar139 = auVar155._8_4_;
        auVar174._8_4_ = fVar139 * fVar142;
        fVar140 = auVar155._12_4_;
        auVar174._12_4_ = fVar140 * fVar162;
        auVar190._0_4_ = fVar163 * fVar143;
        auVar190._4_4_ = fVar180 * fVar126;
        auVar190._8_4_ = fVar163 * fVar139;
        auVar190._12_4_ = fVar180 * fVar140;
        auVar214._0_4_ = fVar200 * fVar143;
        auVar214._4_4_ = fVar201 * fVar126;
        auVar214._8_4_ = fVar200 * fVar139;
        auVar214._12_4_ = fVar201 * fVar140;
        auVar80._0_4_ = fVar251 * fVar143;
        auVar80._4_4_ = fVar265 * fVar126;
        auVar80._8_4_ = fVar251 * fVar139;
        auVar80._12_4_ = fVar265 * fVar140;
        auVar155 = vfmadd231ps_fma(auVar174,auVar71,auVar245);
        auVar72 = vfmadd231ps_fma(auVar190,auVar71,auVar268);
        auVar291 = vfmadd231ps_fma(auVar214,auVar71,auVar303);
        auVar71 = vfmadd231ps_fma(auVar80,auVar71,auVar318);
        auVar161._16_16_ = auVar155;
        auVar161._0_16_ = auVar155;
        auVar179._16_16_ = auVar72;
        auVar179._0_16_ = auVar72;
        auVar198._16_16_ = auVar291;
        auVar198._0_16_ = auVar291;
        auVar230._4_4_ = fVar68;
        auVar230._0_4_ = fVar68;
        auVar230._8_4_ = fVar68;
        auVar230._12_4_ = fVar68;
        auVar230._20_4_ = fVar144;
        auVar230._16_4_ = fVar144;
        auVar230._24_4_ = fVar144;
        auVar230._28_4_ = fVar144;
        auVar92 = vsubps_avx(auVar179,auVar161);
        auVar72 = vfmadd213ps_fma(auVar92,auVar230,auVar161);
        auVar92 = vsubps_avx(auVar198,auVar179);
        auVar70 = vfmadd213ps_fma(auVar92,auVar230,auVar179);
        auVar155 = vsubps_avx(auVar71,auVar291);
        auVar94._16_16_ = auVar155;
        auVar94._0_16_ = auVar155;
        auVar155 = vfmadd213ps_fma(auVar94,auVar230,auVar198);
        auVar92 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar72));
        auVar71 = vfmadd213ps_fma(auVar92,auVar230,ZEXT1632(auVar72));
        auVar92 = vsubps_avx(ZEXT1632(auVar155),ZEXT1632(auVar70));
        auVar155 = vfmadd213ps_fma(auVar92,auVar230,ZEXT1632(auVar70));
        auVar92 = vsubps_avx(ZEXT1632(auVar155),ZEXT1632(auVar71));
        auVar127 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar92,auVar230);
        fVar143 = fVar96 * 0.33333334;
        auVar223._0_8_ =
             CONCAT44(auVar127._4_4_ + fVar143 * auVar92._4_4_ * 3.0,
                      auVar127._0_4_ + fVar143 * auVar92._0_4_ * 3.0);
        auVar223._8_4_ = auVar127._8_4_ + fVar143 * auVar92._8_4_ * 3.0;
        auVar223._12_4_ = auVar127._12_4_ + fVar143 * auVar92._12_4_ * 3.0;
        auVar71 = vshufpd_avx(auVar127,auVar127,3);
        auVar72 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        _local_448 = auVar71;
        auVar155 = vsubps_avx(auVar71,auVar127);
        auVar291 = vsubps_avx(auVar72,(undefined1  [16])0x0);
        auVar81._0_4_ = auVar155._0_4_ + auVar291._0_4_;
        auVar81._4_4_ = auVar155._4_4_ + auVar291._4_4_;
        auVar81._8_4_ = auVar155._8_4_ + auVar291._8_4_;
        auVar81._12_4_ = auVar155._12_4_ + auVar291._12_4_;
        auVar155 = vshufps_avx(auVar127,auVar127,0xb1);
        auVar291 = vshufps_avx(auVar223,auVar223,0xb1);
        auVar319._4_4_ = auVar81._0_4_;
        auVar319._0_4_ = auVar81._0_4_;
        auVar319._8_4_ = auVar81._0_4_;
        auVar319._12_4_ = auVar81._0_4_;
        auVar70 = vshufps_avx(auVar81,auVar81,0x55);
        fVar126 = auVar70._0_4_;
        auVar82._0_4_ = fVar126 * auVar155._0_4_;
        fVar139 = auVar70._4_4_;
        auVar82._4_4_ = fVar139 * auVar155._4_4_;
        fVar140 = auVar70._8_4_;
        auVar82._8_4_ = fVar140 * auVar155._8_4_;
        fVar141 = auVar70._12_4_;
        auVar82._12_4_ = fVar141 * auVar155._12_4_;
        auVar191._0_4_ = fVar126 * auVar291._0_4_;
        auVar191._4_4_ = fVar139 * auVar291._4_4_;
        auVar191._8_4_ = fVar140 * auVar291._8_4_;
        auVar191._12_4_ = fVar141 * auVar291._12_4_;
        auVar107 = vfmadd231ps_fma(auVar82,auVar319,auVar127);
        auVar285 = vfmadd231ps_fma(auVar191,auVar319,auVar223);
        auVar291 = vshufps_avx(auVar107,auVar107,0xe8);
        auVar70 = vshufps_avx(auVar285,auVar285,0xe8);
        auVar155 = vcmpps_avx(auVar291,auVar70,1);
        uVar64 = vextractps_avx(auVar155,0);
        auVar128 = auVar285;
        if ((uVar64 & 1) == 0) {
          auVar128 = auVar107;
        }
        auVar151._0_4_ = fVar143 * auVar92._16_4_ * 3.0;
        auVar151._4_4_ = fVar143 * auVar92._20_4_ * 3.0;
        auVar151._8_4_ = fVar143 * auVar92._24_4_ * 3.0;
        auVar151._12_4_ = fVar143 * 0.0;
        auVar202 = vsubps_avx((undefined1  [16])0x0,auVar151);
        auVar152 = vshufps_avx(auVar202,auVar202,0xb1);
        auVar181 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar224._0_4_ = fVar126 * auVar152._0_4_;
        auVar224._4_4_ = fVar139 * auVar152._4_4_;
        auVar224._8_4_ = fVar140 * auVar152._8_4_;
        auVar224._12_4_ = fVar141 * auVar152._12_4_;
        auVar246._0_4_ = auVar181._0_4_ * fVar126;
        auVar246._4_4_ = auVar181._4_4_ * fVar139;
        auVar246._8_4_ = auVar181._8_4_ * fVar140;
        auVar246._12_4_ = auVar181._12_4_ * fVar141;
        auVar218 = vfmadd231ps_fma(auVar224,auVar319,auVar202);
        auVar219 = vfmadd231ps_fma(auVar246,(undefined1  [16])0x0,auVar319);
        auVar181 = vshufps_avx(auVar218,auVar218,0xe8);
        auVar188 = vshufps_avx(auVar219,auVar219,0xe8);
        auVar152 = vcmpps_avx(auVar181,auVar188,1);
        uVar64 = vextractps_avx(auVar152,0);
        auVar237 = auVar219;
        if ((uVar64 & 1) == 0) {
          auVar237 = auVar218;
        }
        auVar128 = vmaxss_avx(auVar237,auVar128);
        auVar291 = vminps_avx(auVar291,auVar70);
        auVar70 = vminps_avx(auVar181,auVar188);
        auVar70 = vminps_avx(auVar291,auVar70);
        auVar155 = vshufps_avx(auVar155,auVar155,0x55);
        auVar155 = vblendps_avx(auVar155,auVar152,2);
        auVar152 = vpslld_avx(auVar155,0x1f);
        auVar155 = vshufpd_avx(auVar285,auVar285,1);
        auVar155 = vinsertps_avx(auVar155,auVar219,0x9c);
        auVar291 = vshufpd_avx(auVar107,auVar107,1);
        auVar291 = vinsertps_avx(auVar291,auVar218,0x9c);
        auVar155 = vblendvps_avx(auVar291,auVar155,auVar152);
        auVar291 = vmovshdup_avx(auVar155);
        auVar155 = vmaxss_avx(auVar291,auVar155);
        fVar140 = auVar70._0_4_;
        auVar291 = vmovshdup_avx(auVar70);
        fVar139 = auVar155._0_4_;
        fVar143 = auVar291._0_4_;
        fVar126 = auVar128._0_4_;
        if (((fVar140 < 0.0001) && (-0.0001 < fVar139)) || (fVar143 < 0.0001 && -0.0001 < fVar139))
        {
LAB_016daef5:
          auVar107 = vcmpps_avx(auVar70,_DAT_01f7aa10,1);
          auVar285 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar291 = vcmpss_avx(auVar128,ZEXT816(0) << 0x20,1);
          auVar114._8_4_ = 0x3f800000;
          auVar114._0_8_ = 0x3f8000003f800000;
          auVar114._12_4_ = 0x3f800000;
          auVar133._8_4_ = 0xbf800000;
          auVar133._0_8_ = 0xbf800000bf800000;
          auVar133._12_4_ = 0xbf800000;
          auVar291 = vblendvps_avx(auVar114,auVar133,auVar291);
          auVar107 = vblendvps_avx(auVar114,auVar133,auVar107);
          fVar164 = auVar107._0_4_;
          fVar141 = auVar291._0_4_;
          auVar291 = SUB6416(ZEXT864(0),0) << 0x20;
          if ((fVar164 == fVar141) && (!NAN(fVar164) && !NAN(fVar141))) {
            auVar291 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar164 == fVar141) && (!NAN(fVar164) && !NAN(fVar141))) {
            auVar285 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar107 = vmovshdup_avx(auVar107);
          fVar231 = auVar107._0_4_;
          if ((fVar164 != fVar231) || (NAN(fVar164) || NAN(fVar231))) {
            if ((fVar143 != fVar140) || (NAN(fVar143) || NAN(fVar140))) {
              auVar153._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
              auVar153._8_4_ = auVar70._8_4_ ^ 0x80000000;
              auVar153._12_4_ = auVar70._12_4_ ^ 0x80000000;
              auVar154._0_4_ = -fVar140 / (fVar143 - fVar140);
              auVar154._4_12_ = auVar153._4_12_;
              auVar70 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar154._0_4_)),auVar154,ZEXT416(0));
              auVar107 = auVar70;
            }
            else {
              auVar70 = ZEXT816(0) << 0x20;
              if ((fVar140 != 0.0) || (auVar107 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar140))) {
                auVar70 = SUB6416(ZEXT464(0x7f800000),0);
                auVar107 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar291 = vminss_avx(auVar291,auVar70);
            auVar285 = vmaxss_avx(auVar107,auVar285);
          }
          auVar155 = vcmpss_avx(auVar155,ZEXT416(0),1);
          auVar115._8_4_ = 0x3f800000;
          auVar115._0_8_ = 0x3f8000003f800000;
          auVar115._12_4_ = 0x3f800000;
          auVar134._8_4_ = 0xbf800000;
          auVar134._0_8_ = 0xbf800000bf800000;
          auVar134._12_4_ = 0xbf800000;
          auVar155 = vblendvps_avx(auVar115,auVar134,auVar155);
          fVar143 = auVar155._0_4_;
          if ((fVar141 != fVar143) || (NAN(fVar141) || NAN(fVar143))) {
            if ((fVar139 != fVar126) || (NAN(fVar139) || NAN(fVar126))) {
              auVar83._0_8_ = auVar128._0_8_ ^ 0x8000000080000000;
              auVar83._8_4_ = auVar128._8_4_ ^ 0x80000000;
              auVar83._12_4_ = auVar128._12_4_ ^ 0x80000000;
              auVar156._0_4_ = -fVar126 / (fVar139 - fVar126);
              auVar156._4_12_ = auVar83._4_12_;
              auVar155 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar156._0_4_)),auVar156,ZEXT416(0));
              auVar70 = auVar155;
            }
            else {
              auVar155 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar126 != 0.0) || (auVar70 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar126))) {
                auVar155 = SUB6416(ZEXT464(0xff800000),0);
                auVar70 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar291 = vminss_avx(auVar291,auVar70);
            auVar285 = vmaxss_avx(auVar155,auVar285);
          }
          if ((fVar231 != fVar143) || (NAN(fVar231) || NAN(fVar143))) {
            auVar291 = vminss_avx(auVar291,SUB6416(ZEXT464(0x3f800000),0));
            auVar285 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar285);
          }
          auVar155 = vmaxss_avx(ZEXT816(0) << 0x40,auVar291);
          auVar291 = vminss_avx(auVar285,SUB6416(ZEXT464(0x3f800000),0));
          if (auVar155._0_4_ <= auVar291._0_4_) {
            auVar155 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar155._0_4_ + -0.1)));
            auVar291 = vminss_avx(ZEXT416((uint)(auVar291._0_4_ + 0.1)),
                                  SUB6416(ZEXT464(0x3f800000),0));
            auVar175._0_8_ = auVar127._0_8_;
            auVar175._8_8_ = auVar175._0_8_;
            auVar257._8_8_ = auVar223._0_8_;
            auVar257._0_8_ = auVar223._0_8_;
            auVar269._8_8_ = auVar202._0_8_;
            auVar269._0_8_ = auVar202._0_8_;
            auVar70 = vshufpd_avx(auVar223,auVar223,3);
            auVar107 = vshufpd_avx(auVar202,auVar202,3);
            auVar285 = vshufps_avx(auVar155,auVar291,0);
            auVar84._8_4_ = 0x3f800000;
            auVar84._0_8_ = 0x3f8000003f800000;
            auVar84._12_4_ = 0x3f800000;
            auVar127 = vsubps_avx(auVar84,auVar285);
            local_448._0_4_ = auVar71._0_4_;
            local_448._4_4_ = auVar71._4_4_;
            fStack_440 = auVar71._8_4_;
            fStack_43c = auVar71._12_4_;
            fVar143 = auVar285._0_4_;
            auVar85._0_4_ = fVar143 * (float)local_448._0_4_;
            fVar126 = auVar285._4_4_;
            auVar85._4_4_ = fVar126 * (float)local_448._4_4_;
            fVar139 = auVar285._8_4_;
            auVar85._8_4_ = fVar139 * fStack_440;
            fVar140 = auVar285._12_4_;
            auVar85._12_4_ = fVar140 * fStack_43c;
            auVar215._0_4_ = fVar143 * auVar70._0_4_;
            auVar215._4_4_ = fVar126 * auVar70._4_4_;
            auVar215._8_4_ = fVar139 * auVar70._8_4_;
            auVar215._12_4_ = fVar140 * auVar70._12_4_;
            auVar225._0_4_ = fVar143 * auVar107._0_4_;
            auVar225._4_4_ = fVar126 * auVar107._4_4_;
            auVar225._8_4_ = fVar139 * auVar107._8_4_;
            auVar225._12_4_ = fVar140 * auVar107._12_4_;
            local_4f8 = auVar72._0_4_;
            fStack_4f4 = auVar72._4_4_;
            fStack_4f0 = auVar72._8_4_;
            fStack_4ec = auVar72._12_4_;
            auVar247._0_4_ = fVar143 * local_4f8;
            auVar247._4_4_ = fVar126 * fStack_4f4;
            auVar247._8_4_ = fVar139 * fStack_4f0;
            auVar247._12_4_ = fVar140 * fStack_4ec;
            auVar70 = vfmadd231ps_fma(auVar85,auVar127,auVar175);
            auVar107 = vfmadd231ps_fma(auVar215,auVar127,auVar257);
            auVar285 = vfmadd231ps_fma(auVar225,auVar127,auVar269);
            auVar127 = vfmadd231ps_fma(auVar247,auVar127,ZEXT816(0));
            auVar71 = vmovshdup_avx(auVar189);
            auVar202 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar155._0_4_)),auVar189,
                                       ZEXT416((uint)(1.0 - auVar155._0_4_)));
            auVar218 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar291._0_4_)),auVar189,
                                       ZEXT416((uint)(1.0 - auVar291._0_4_)));
            fVar143 = 1.0 / fVar96;
            auVar155 = vsubps_avx(auVar107,auVar70);
            auVar258._0_4_ = auVar155._0_4_ * 3.0;
            auVar258._4_4_ = auVar155._4_4_ * 3.0;
            auVar258._8_4_ = auVar155._8_4_ * 3.0;
            auVar258._12_4_ = auVar155._12_4_ * 3.0;
            auVar155 = vsubps_avx(auVar285,auVar107);
            auVar270._0_4_ = auVar155._0_4_ * 3.0;
            auVar270._4_4_ = auVar155._4_4_ * 3.0;
            auVar270._8_4_ = auVar155._8_4_ * 3.0;
            auVar270._12_4_ = auVar155._12_4_ * 3.0;
            auVar155 = vsubps_avx(auVar127,auVar285);
            auVar286._0_4_ = auVar155._0_4_ * 3.0;
            auVar286._4_4_ = auVar155._4_4_ * 3.0;
            auVar286._8_4_ = auVar155._8_4_ * 3.0;
            auVar286._12_4_ = auVar155._12_4_ * 3.0;
            auVar71 = vminps_avx(auVar270,auVar286);
            auVar155 = vmaxps_avx(auVar270,auVar286);
            auVar71 = vminps_avx(auVar258,auVar71);
            auVar155 = vmaxps_avx(auVar258,auVar155);
            auVar72 = vshufpd_avx(auVar71,auVar71,3);
            auVar291 = vshufpd_avx(auVar155,auVar155,3);
            auVar71 = vminps_avx(auVar71,auVar72);
            auVar155 = vmaxps_avx(auVar155,auVar291);
            auVar271._0_4_ = auVar71._0_4_ * fVar143;
            auVar271._4_4_ = auVar71._4_4_ * fVar143;
            auVar271._8_4_ = auVar71._8_4_ * fVar143;
            auVar271._12_4_ = auVar71._12_4_ * fVar143;
            auVar259._0_4_ = auVar155._0_4_ * fVar143;
            auVar259._4_4_ = auVar155._4_4_ * fVar143;
            auVar259._8_4_ = auVar155._8_4_ * fVar143;
            auVar259._12_4_ = auVar155._12_4_ * fVar143;
            fVar143 = 1.0 / (auVar218._0_4_ - auVar202._0_4_);
            auVar155 = vshufpd_avx(auVar70,auVar70,3);
            auVar71 = vshufpd_avx(auVar107,auVar107,3);
            auVar72 = vshufpd_avx(auVar285,auVar285,3);
            auVar291 = vshufpd_avx(auVar127,auVar127,3);
            auVar155 = vsubps_avx(auVar155,auVar70);
            auVar70 = vsubps_avx(auVar71,auVar107);
            auVar107 = vsubps_avx(auVar72,auVar285);
            auVar291 = vsubps_avx(auVar291,auVar127);
            auVar71 = vminps_avx(auVar155,auVar70);
            auVar155 = vmaxps_avx(auVar155,auVar70);
            auVar72 = vminps_avx(auVar107,auVar291);
            auVar72 = vminps_avx(auVar71,auVar72);
            auVar71 = vmaxps_avx(auVar107,auVar291);
            auVar155 = vmaxps_avx(auVar155,auVar71);
            auVar304._0_4_ = fVar143 * auVar72._0_4_;
            auVar304._4_4_ = fVar143 * auVar72._4_4_;
            auVar304._8_4_ = fVar143 * auVar72._8_4_;
            auVar304._12_4_ = fVar143 * auVar72._12_4_;
            auVar292._0_4_ = fVar143 * auVar155._0_4_;
            auVar292._4_4_ = fVar143 * auVar155._4_4_;
            auVar292._8_4_ = fVar143 * auVar155._8_4_;
            auVar292._12_4_ = fVar143 * auVar155._12_4_;
            auVar291 = vinsertps_avx(auVar158,auVar202,0x10);
            auVar70 = vinsertps_avx(auVar159,auVar218,0x10);
            auVar287._0_4_ = (auVar291._0_4_ + auVar70._0_4_) * 0.5;
            auVar287._4_4_ = (auVar291._4_4_ + auVar70._4_4_) * 0.5;
            auVar287._8_4_ = (auVar291._8_4_ + auVar70._8_4_) * 0.5;
            auVar287._12_4_ = (auVar291._12_4_ + auVar70._12_4_) * 0.5;
            auVar86._4_4_ = auVar287._0_4_;
            auVar86._0_4_ = auVar287._0_4_;
            auVar86._8_4_ = auVar287._0_4_;
            auVar86._12_4_ = auVar287._0_4_;
            auVar155 = vfmadd213ps_fma(local_278,auVar86,auVar16);
            auVar71 = vfmadd213ps_fma(local_288,auVar86,auVar17);
            auVar72 = vfmadd213ps_fma(local_298,auVar86,auVar18);
            auVar159 = vsubps_avx(auVar71,auVar155);
            auVar155 = vfmadd213ps_fma(auVar159,auVar86,auVar155);
            auVar159 = vsubps_avx(auVar72,auVar71);
            auVar159 = vfmadd213ps_fma(auVar159,auVar86,auVar71);
            auVar159 = vsubps_avx(auVar159,auVar155);
            auVar155 = vfmadd231ps_fma(auVar155,auVar159,auVar86);
            auVar87._0_8_ = CONCAT44(auVar159._4_4_ * 3.0,auVar159._0_4_ * 3.0);
            auVar87._8_4_ = auVar159._8_4_ * 3.0;
            auVar87._12_4_ = auVar159._12_4_ * 3.0;
            auVar320._8_8_ = auVar155._0_8_;
            auVar320._0_8_ = auVar155._0_8_;
            auVar159 = vshufpd_avx(auVar155,auVar155,3);
            auVar155 = vshufps_avx(auVar287,auVar287,0x55);
            auVar285 = vsubps_avx(auVar159,auVar320);
            auVar128 = vfmadd231ps_fma(auVar320,auVar155,auVar285);
            auVar331._8_8_ = auVar87._0_8_;
            auVar331._0_8_ = auVar87._0_8_;
            auVar159 = vshufpd_avx(auVar87,auVar87,3);
            auVar159 = vsubps_avx(auVar159,auVar331);
            auVar127 = vfmadd213ps_fma(auVar159,auVar155,auVar331);
            auVar155 = vmovshdup_avx(auVar127);
            auVar332._0_8_ = auVar155._0_8_ ^ 0x8000000080000000;
            auVar332._8_4_ = auVar155._8_4_ ^ 0x80000000;
            auVar332._12_4_ = auVar155._12_4_ ^ 0x80000000;
            auVar71 = vmovshdup_avx(auVar285);
            auVar159 = vunpcklps_avx(auVar71,auVar332);
            auVar72 = vshufps_avx(auVar159,auVar332,4);
            auVar107 = vshufps_avx(auVar287,auVar287,0x54);
            auVar157._0_8_ = auVar285._0_8_ ^ 0x8000000080000000;
            auVar157._8_4_ = auVar285._8_4_ ^ 0x80000000;
            auVar157._12_4_ = auVar285._12_4_ ^ 0x80000000;
            auVar159 = vmovlhps_avx(auVar157,auVar127);
            auVar159 = vshufps_avx(auVar159,auVar127,8);
            auVar155 = vfmsub231ss_fma(ZEXT416((uint)(auVar285._0_4_ * auVar155._0_4_)),auVar71,
                                       auVar127);
            uVar69 = auVar155._0_4_;
            auVar88._4_4_ = uVar69;
            auVar88._0_4_ = uVar69;
            auVar88._8_4_ = uVar69;
            auVar88._12_4_ = uVar69;
            auVar155 = vdivps_avx(auVar72,auVar88);
            auVar71 = vdivps_avx(auVar159,auVar88);
            fVar139 = auVar128._0_4_;
            fVar143 = auVar155._0_4_;
            auVar159 = vshufps_avx(auVar128,auVar128,0x55);
            fVar126 = auVar71._0_4_;
            auVar89._0_4_ = fVar139 * fVar143 + auVar159._0_4_ * fVar126;
            auVar89._4_4_ = fVar139 * auVar155._4_4_ + auVar159._4_4_ * auVar71._4_4_;
            auVar89._8_4_ = fVar139 * auVar155._8_4_ + auVar159._8_4_ * auVar71._8_4_;
            auVar89._12_4_ = fVar139 * auVar155._12_4_ + auVar159._12_4_ * auVar71._12_4_;
            auVar188 = vsubps_avx(auVar107,auVar89);
            auVar107 = vmovshdup_avx(auVar155);
            auVar159 = vinsertps_avx(auVar271,auVar304,0x1c);
            auVar192._0_4_ = auVar107._0_4_ * auVar159._0_4_;
            auVar192._4_4_ = auVar107._4_4_ * auVar159._4_4_;
            auVar192._8_4_ = auVar107._8_4_ * auVar159._8_4_;
            auVar192._12_4_ = auVar107._12_4_ * auVar159._12_4_;
            auVar72 = vinsertps_avx(auVar259,auVar292,0x1c);
            auVar116._0_4_ = auVar72._0_4_ * auVar107._0_4_;
            auVar116._4_4_ = auVar72._4_4_ * auVar107._4_4_;
            auVar116._8_4_ = auVar72._8_4_ * auVar107._8_4_;
            auVar116._12_4_ = auVar72._12_4_ * auVar107._12_4_;
            auVar128 = vminps_avx(auVar192,auVar116);
            auVar127 = vmaxps_avx(auVar116,auVar192);
            auVar107 = vinsertps_avx(auVar304,auVar271,0x4c);
            auVar152 = vmovshdup_avx(auVar71);
            auVar285 = vinsertps_avx(auVar292,auVar259,0x4c);
            auVar293._0_4_ = auVar152._0_4_ * auVar107._0_4_;
            auVar293._4_4_ = auVar152._4_4_ * auVar107._4_4_;
            auVar293._8_4_ = auVar152._8_4_ * auVar107._8_4_;
            auVar293._12_4_ = auVar152._12_4_ * auVar107._12_4_;
            auVar272._0_4_ = auVar152._0_4_ * auVar285._0_4_;
            auVar272._4_4_ = auVar152._4_4_ * auVar285._4_4_;
            auVar272._8_4_ = auVar152._8_4_ * auVar285._8_4_;
            auVar272._12_4_ = auVar152._12_4_ * auVar285._12_4_;
            auVar152 = vminps_avx(auVar293,auVar272);
            auVar305._0_4_ = auVar128._0_4_ + auVar152._0_4_;
            auVar305._4_4_ = auVar128._4_4_ + auVar152._4_4_;
            auVar305._8_4_ = auVar128._8_4_ + auVar152._8_4_;
            auVar305._12_4_ = auVar128._12_4_ + auVar152._12_4_;
            auVar128 = vmaxps_avx(auVar272,auVar293);
            auVar117._0_4_ = auVar128._0_4_ + auVar127._0_4_;
            auVar117._4_4_ = auVar128._4_4_ + auVar127._4_4_;
            auVar117._8_4_ = auVar128._8_4_ + auVar127._8_4_;
            auVar117._12_4_ = auVar128._12_4_ + auVar127._12_4_;
            auVar273._8_8_ = 0x3f80000000000000;
            auVar273._0_8_ = 0x3f80000000000000;
            auVar127 = vsubps_avx(auVar273,auVar117);
            auVar128 = vsubps_avx(auVar273,auVar305);
            auVar152 = vsubps_avx(auVar291,auVar287);
            auVar181 = vsubps_avx(auVar70,auVar287);
            auVar135._0_4_ = fVar143 * auVar159._0_4_;
            auVar135._4_4_ = fVar143 * auVar159._4_4_;
            auVar135._8_4_ = fVar143 * auVar159._8_4_;
            auVar135._12_4_ = fVar143 * auVar159._12_4_;
            auVar306._0_4_ = fVar143 * auVar72._0_4_;
            auVar306._4_4_ = fVar143 * auVar72._4_4_;
            auVar306._8_4_ = fVar143 * auVar72._8_4_;
            auVar306._12_4_ = fVar143 * auVar72._12_4_;
            auVar72 = vminps_avx(auVar135,auVar306);
            auVar159 = vmaxps_avx(auVar306,auVar135);
            auVar193._0_4_ = fVar126 * auVar107._0_4_;
            auVar193._4_4_ = fVar126 * auVar107._4_4_;
            auVar193._8_4_ = fVar126 * auVar107._8_4_;
            auVar193._12_4_ = fVar126 * auVar107._12_4_;
            auVar260._0_4_ = fVar126 * auVar285._0_4_;
            auVar260._4_4_ = fVar126 * auVar285._4_4_;
            auVar260._8_4_ = fVar126 * auVar285._8_4_;
            auVar260._12_4_ = fVar126 * auVar285._12_4_;
            auVar107 = vminps_avx(auVar193,auVar260);
            auVar307._0_4_ = auVar72._0_4_ + auVar107._0_4_;
            auVar307._4_4_ = auVar72._4_4_ + auVar107._4_4_;
            auVar307._8_4_ = auVar72._8_4_ + auVar107._8_4_;
            auVar307._12_4_ = auVar72._12_4_ + auVar107._12_4_;
            fVar231 = auVar152._0_4_;
            auVar321._0_4_ = fVar231 * auVar127._0_4_;
            fVar232 = auVar152._4_4_;
            auVar321._4_4_ = fVar232 * auVar127._4_4_;
            fVar233 = auVar152._8_4_;
            auVar321._8_4_ = fVar233 * auVar127._8_4_;
            fVar234 = auVar152._12_4_;
            auVar321._12_4_ = fVar234 * auVar127._12_4_;
            auVar72 = vmaxps_avx(auVar260,auVar193);
            auVar261._0_4_ = fVar231 * auVar128._0_4_;
            auVar261._4_4_ = fVar232 * auVar128._4_4_;
            auVar261._8_4_ = fVar233 * auVar128._8_4_;
            auVar261._12_4_ = fVar234 * auVar128._12_4_;
            fVar139 = auVar181._0_4_;
            auVar118._0_4_ = fVar139 * auVar127._0_4_;
            fVar140 = auVar181._4_4_;
            auVar118._4_4_ = fVar140 * auVar127._4_4_;
            fVar141 = auVar181._8_4_;
            auVar118._8_4_ = fVar141 * auVar127._8_4_;
            fVar164 = auVar181._12_4_;
            auVar118._12_4_ = fVar164 * auVar127._12_4_;
            auVar274._0_4_ = fVar139 * auVar128._0_4_;
            auVar274._4_4_ = fVar140 * auVar128._4_4_;
            auVar274._8_4_ = fVar141 * auVar128._8_4_;
            auVar274._12_4_ = fVar164 * auVar128._12_4_;
            auVar136._0_4_ = auVar159._0_4_ + auVar72._0_4_;
            auVar136._4_4_ = auVar159._4_4_ + auVar72._4_4_;
            auVar136._8_4_ = auVar159._8_4_ + auVar72._8_4_;
            auVar136._12_4_ = auVar159._12_4_ + auVar72._12_4_;
            auVar194._8_8_ = 0x3f800000;
            auVar194._0_8_ = 0x3f800000;
            auVar159 = vsubps_avx(auVar194,auVar136);
            auVar72 = vsubps_avx(auVar194,auVar307);
            auVar308._0_4_ = fVar231 * auVar159._0_4_;
            auVar308._4_4_ = fVar232 * auVar159._4_4_;
            auVar308._8_4_ = fVar233 * auVar159._8_4_;
            auVar308._12_4_ = fVar234 * auVar159._12_4_;
            auVar294._0_4_ = fVar231 * auVar72._0_4_;
            auVar294._4_4_ = fVar232 * auVar72._4_4_;
            auVar294._8_4_ = fVar233 * auVar72._8_4_;
            auVar294._12_4_ = fVar234 * auVar72._12_4_;
            auVar137._0_4_ = fVar139 * auVar159._0_4_;
            auVar137._4_4_ = fVar140 * auVar159._4_4_;
            auVar137._8_4_ = fVar141 * auVar159._8_4_;
            auVar137._12_4_ = fVar164 * auVar159._12_4_;
            auVar195._0_4_ = fVar139 * auVar72._0_4_;
            auVar195._4_4_ = fVar140 * auVar72._4_4_;
            auVar195._8_4_ = fVar141 * auVar72._8_4_;
            auVar195._12_4_ = fVar164 * auVar72._12_4_;
            auVar159 = vminps_avx(auVar308,auVar294);
            auVar72 = vminps_avx(auVar137,auVar195);
            auVar159 = vminps_avx(auVar159,auVar72);
            auVar72 = vmaxps_avx(auVar294,auVar308);
            auVar107 = vmaxps_avx(auVar195,auVar137);
            auVar285 = vminps_avx(auVar321,auVar261);
            auVar127 = vminps_avx(auVar118,auVar274);
            auVar285 = vminps_avx(auVar285,auVar127);
            auVar159 = vhaddps_avx(auVar159,auVar285);
            auVar72 = vmaxps_avx(auVar107,auVar72);
            auVar107 = vmaxps_avx(auVar261,auVar321);
            auVar285 = vmaxps_avx(auVar274,auVar118);
            auVar107 = vmaxps_avx(auVar285,auVar107);
            auVar72 = vhaddps_avx(auVar72,auVar107);
            auVar159 = vshufps_avx(auVar159,auVar159,0xe8);
            auVar72 = vshufps_avx(auVar72,auVar72,0xe8);
            auVar275._0_4_ = auVar188._0_4_ + auVar159._0_4_;
            auVar275._4_4_ = auVar188._4_4_ + auVar159._4_4_;
            auVar275._8_4_ = auVar188._8_4_ + auVar159._8_4_;
            auVar275._12_4_ = auVar188._12_4_ + auVar159._12_4_;
            auVar262._0_4_ = auVar188._0_4_ + auVar72._0_4_;
            auVar262._4_4_ = auVar188._4_4_ + auVar72._4_4_;
            auVar262._8_4_ = auVar188._8_4_ + auVar72._8_4_;
            auVar262._12_4_ = auVar188._12_4_ + auVar72._12_4_;
            auVar159 = vmaxps_avx(auVar291,auVar275);
            auVar72 = vminps_avx(auVar262,auVar70);
            auVar159 = vcmpps_avx(auVar72,auVar159,1);
            auVar159 = vshufps_avx(auVar159,auVar159,0x50);
            if ((auVar159 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar159[0xf]) {
              bVar62 = 0;
              if ((fVar68 < auVar275._0_4_) && (bVar62 = 0, auVar262._0_4_ < auVar70._0_4_)) {
                auVar72 = vmovshdup_avx(auVar275);
                auVar159 = vcmpps_avx(auVar262,auVar70,1);
                bVar62 = auVar159[4] & auVar202._0_4_ < auVar72._0_4_;
              }
              if (((3 < uVar66 || fVar96 < 0.001) | bVar62) != 1) goto LAB_016dbb60;
              lVar61 = 200;
              do {
                fVar139 = auVar188._0_4_;
                fVar68 = 1.0 - fVar139;
                fVar96 = fVar68 * fVar68 * fVar68;
                fVar144 = fVar139 * 3.0 * fVar68 * fVar68;
                fVar68 = fVar68 * fVar139 * fVar139 * 3.0;
                auVar176._4_4_ = fVar96;
                auVar176._0_4_ = fVar96;
                auVar176._8_4_ = fVar96;
                auVar176._12_4_ = fVar96;
                auVar138._4_4_ = fVar144;
                auVar138._0_4_ = fVar144;
                auVar138._8_4_ = fVar144;
                auVar138._12_4_ = fVar144;
                auVar119._4_4_ = fVar68;
                auVar119._0_4_ = fVar68;
                auVar119._8_4_ = fVar68;
                auVar119._12_4_ = fVar68;
                fVar139 = fVar139 * fVar139 * fVar139;
                local_538._0_4_ = auVar19._0_4_;
                local_538._4_4_ = auVar19._4_4_;
                fStack_530 = auVar19._8_4_;
                fStack_52c = auVar19._12_4_;
                auVar196._0_4_ = fVar139 * (float)local_538._0_4_;
                auVar196._4_4_ = fVar139 * (float)local_538._4_4_;
                auVar196._8_4_ = fVar139 * fStack_530;
                auVar196._12_4_ = fVar139 * fStack_52c;
                auVar158 = vfmadd231ps_fma(auVar196,auVar119,auVar18);
                auVar158 = vfmadd231ps_fma(auVar158,auVar138,auVar17);
                auVar158 = vfmadd231ps_fma(auVar158,auVar176,auVar16);
                auVar120._8_8_ = auVar158._0_8_;
                auVar120._0_8_ = auVar158._0_8_;
                auVar158 = vshufpd_avx(auVar158,auVar158,3);
                auVar159 = vshufps_avx(auVar188,auVar188,0x55);
                auVar158 = vsubps_avx(auVar158,auVar120);
                auVar159 = vfmadd213ps_fma(auVar158,auVar159,auVar120);
                fVar96 = auVar159._0_4_;
                auVar158 = vshufps_avx(auVar159,auVar159,0x55);
                auVar121._0_4_ = fVar143 * fVar96 + fVar126 * auVar158._0_4_;
                auVar121._4_4_ = auVar155._4_4_ * fVar96 + auVar71._4_4_ * auVar158._4_4_;
                auVar121._8_4_ = auVar155._8_4_ * fVar96 + auVar71._8_4_ * auVar158._8_4_;
                auVar121._12_4_ = auVar155._12_4_ * fVar96 + auVar71._12_4_ * auVar158._12_4_;
                auVar188 = vsubps_avx(auVar188,auVar121);
                auVar158 = vandps_avx(local_398,auVar159);
                auVar159 = vshufps_avx(auVar158,auVar158,0xf5);
                auVar158 = vmaxss_avx(auVar159,auVar158);
                if (auVar158._0_4_ < fVar95) {
                  local_1f8 = auVar188._0_4_;
                  if ((0.0 <= local_1f8) && (local_1f8 <= 1.0)) {
                    auVar158 = vmovshdup_avx(auVar188);
                    fVar96 = auVar158._0_4_;
                    if ((0.0 <= fVar96) && (fVar96 <= 1.0)) {
                      auVar158 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                               ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                               0x1c);
                      auVar107 = vinsertps_avx(auVar158,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                      auVar158 = vdpps_avx(auVar107,local_3a8,0x7f);
                      auVar159 = vdpps_avx(auVar107,local_3b8,0x7f);
                      auVar155 = vdpps_avx(auVar107,local_2a8,0x7f);
                      auVar71 = vdpps_avx(auVar107,local_2b8,0x7f);
                      auVar72 = vdpps_avx(auVar107,local_2c8,0x7f);
                      auVar291 = vdpps_avx(auVar107,local_2d8,0x7f);
                      auVar70 = vdpps_avx(auVar107,local_2e8,0x7f);
                      auVar107 = vdpps_avx(auVar107,local_2f8,0x7f);
                      fVar144 = 1.0 - fVar96;
                      auVar158 = vfmadd231ss_fma(ZEXT416((uint)(fVar96 * auVar72._0_4_)),
                                                 ZEXT416((uint)fVar144),auVar158);
                      auVar159 = vfmadd231ss_fma(ZEXT416((uint)(auVar291._0_4_ * fVar96)),
                                                 ZEXT416((uint)fVar144),auVar159);
                      auVar155 = vfmadd231ss_fma(ZEXT416((uint)(auVar70._0_4_ * fVar96)),
                                                 ZEXT416((uint)fVar144),auVar155);
                      auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar96 * auVar107._0_4_)),
                                                ZEXT416((uint)fVar144),auVar71);
                      fVar126 = 1.0 - local_1f8;
                      fVar144 = fVar126 * local_1f8 * local_1f8 * 3.0;
                      fVar140 = local_1f8 * local_1f8 * local_1f8;
                      auVar155 = vfmadd231ss_fma(ZEXT416((uint)(fVar140 * auVar71._0_4_)),
                                                 ZEXT416((uint)fVar144),auVar155);
                      fVar68 = local_1f8 * 3.0 * fVar126 * fVar126;
                      auVar159 = vfmadd231ss_fma(auVar155,ZEXT416((uint)fVar68),auVar159);
                      fVar143 = fVar126 * fVar126 * fVar126;
                      auVar158 = vfmadd231ss_fma(auVar159,ZEXT416((uint)fVar143),auVar158);
                      fVar139 = auVar158._0_4_;
                      if (((fVar67 <= fVar139) &&
                          (fVar141 = *(float *)(ray + k * 4 + 0x80), fVar139 <= fVar141)) &&
                         (pGVar8 = (context->scene->geometries).items[uVar58].ptr,
                         (pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                        auVar158 = vshufps_avx(auVar188,auVar188,0x55);
                        auVar263._8_4_ = 0x3f800000;
                        auVar263._0_8_ = 0x3f8000003f800000;
                        auVar263._12_4_ = 0x3f800000;
                        auVar159 = vsubps_avx(auVar263,auVar158);
                        fVar164 = auVar158._0_4_;
                        auVar276._0_4_ = fVar164 * (float)local_3e8._0_4_;
                        fVar231 = auVar158._4_4_;
                        auVar276._4_4_ = fVar231 * (float)local_3e8._4_4_;
                        fVar232 = auVar158._8_4_;
                        auVar276._8_4_ = fVar232 * fStack_3e0;
                        fVar233 = auVar158._12_4_;
                        auVar276._12_4_ = fVar233 * fStack_3dc;
                        auVar288._0_4_ = fVar164 * (float)local_3f8._0_4_;
                        auVar288._4_4_ = fVar231 * (float)local_3f8._4_4_;
                        auVar288._8_4_ = fVar232 * fStack_3f0;
                        auVar288._12_4_ = fVar233 * fStack_3ec;
                        local_4c8 = auVar22._0_4_;
                        fStack_4c4 = auVar22._4_4_;
                        fStack_4c0 = auVar22._8_4_;
                        fStack_4bc = auVar22._12_4_;
                        auVar295._0_4_ = fVar164 * local_4c8;
                        auVar295._4_4_ = fVar231 * fStack_4c4;
                        auVar295._8_4_ = fVar232 * fStack_4c0;
                        auVar295._12_4_ = fVar233 * fStack_4bc;
                        local_4d8 = auVar327._0_4_;
                        fStack_4d4 = auVar327._4_4_;
                        fStack_4d0 = auVar327._8_4_;
                        fStack_4cc = auVar327._12_4_;
                        auVar309._0_4_ = fVar164 * local_4d8;
                        auVar309._4_4_ = fVar231 * fStack_4d4;
                        auVar309._8_4_ = fVar232 * fStack_4d0;
                        auVar309._12_4_ = fVar233 * fStack_4cc;
                        auVar155 = vfmadd231ps_fma(auVar276,auVar159,local_3c8);
                        auVar71 = vfmadd231ps_fma(auVar288,auVar159,auVar20);
                        auVar72 = vfmadd231ps_fma(auVar295,auVar159,local_3d8);
                        auVar291 = vfmadd231ps_fma(auVar309,auVar159,auVar21);
                        auVar159 = vsubps_avx(auVar71,auVar155);
                        auVar155 = vsubps_avx(auVar72,auVar71);
                        auVar71 = vsubps_avx(auVar291,auVar72);
                        auVar310._0_4_ = local_1f8 * auVar155._0_4_;
                        auVar310._4_4_ = local_1f8 * auVar155._4_4_;
                        auVar310._8_4_ = local_1f8 * auVar155._8_4_;
                        auVar310._12_4_ = local_1f8 * auVar155._12_4_;
                        auVar248._4_4_ = fVar126;
                        auVar248._0_4_ = fVar126;
                        auVar248._8_4_ = fVar126;
                        auVar248._12_4_ = fVar126;
                        auVar159 = vfmadd231ps_fma(auVar310,auVar248,auVar159);
                        auVar277._0_4_ = local_1f8 * auVar71._0_4_;
                        auVar277._4_4_ = local_1f8 * auVar71._4_4_;
                        auVar277._8_4_ = local_1f8 * auVar71._8_4_;
                        auVar277._12_4_ = local_1f8 * auVar71._12_4_;
                        auVar155 = vfmadd231ps_fma(auVar277,auVar248,auVar155);
                        auVar278._0_4_ = local_1f8 * auVar155._0_4_;
                        auVar278._4_4_ = local_1f8 * auVar155._4_4_;
                        auVar278._8_4_ = local_1f8 * auVar155._8_4_;
                        auVar278._12_4_ = local_1f8 * auVar155._12_4_;
                        auVar155 = vfmadd231ps_fma(auVar278,auVar248,auVar159);
                        auVar226._0_4_ = fVar140 * (float)local_348._0_4_;
                        auVar226._4_4_ = fVar140 * (float)local_348._4_4_;
                        auVar226._8_4_ = fVar140 * fStack_340;
                        auVar226._12_4_ = fVar140 * fStack_33c;
                        auVar177._4_4_ = fVar144;
                        auVar177._0_4_ = fVar144;
                        auVar177._8_4_ = fVar144;
                        auVar177._12_4_ = fVar144;
                        auVar159 = vfmadd132ps_fma(auVar177,auVar226,local_338);
                        auVar216._4_4_ = fVar68;
                        auVar216._0_4_ = fVar68;
                        auVar216._8_4_ = fVar68;
                        auVar216._12_4_ = fVar68;
                        auVar159 = vfmadd132ps_fma(auVar216,auVar159,local_328);
                        auVar227._0_4_ = auVar155._0_4_ * 3.0;
                        auVar227._4_4_ = auVar155._4_4_ * 3.0;
                        auVar227._8_4_ = auVar155._8_4_ * 3.0;
                        auVar227._12_4_ = auVar155._12_4_ * 3.0;
                        auVar197._4_4_ = fVar143;
                        auVar197._0_4_ = fVar143;
                        auVar197._8_4_ = fVar143;
                        auVar197._12_4_ = fVar143;
                        auVar155 = vfmadd132ps_fma(auVar197,auVar159,local_318);
                        auVar159 = vshufps_avx(auVar227,auVar227,0xc9);
                        auVar178._0_4_ = auVar155._0_4_ * auVar159._0_4_;
                        auVar178._4_4_ = auVar155._4_4_ * auVar159._4_4_;
                        auVar178._8_4_ = auVar155._8_4_ * auVar159._8_4_;
                        auVar178._12_4_ = auVar155._12_4_ * auVar159._12_4_;
                        auVar159 = vshufps_avx(auVar155,auVar155,0xc9);
                        auVar159 = vfmsub231ps_fma(auVar178,auVar227,auVar159);
                        local_208 = auVar159._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar139;
                          uVar69 = vextractps_avx(auVar159,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar69;
                          uVar69 = vextractps_avx(auVar159,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar69;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = local_208;
                          *(float *)(ray + k * 4 + 0xf0) = local_1f8;
                          *(float *)(ray + k * 4 + 0x100) = fVar96;
                          *(uint *)(ray + k * 4 + 0x110) = uVar7;
                          *(uint *)(ray + k * 4 + 0x120) = uVar58;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          auVar155 = vshufps_avx(auVar159,auVar159,0x55);
                          auVar159 = vshufps_avx(auVar159,auVar159,0xaa);
                          local_228[0] = (RTCHitN)auVar155[0];
                          local_228[1] = (RTCHitN)auVar155[1];
                          local_228[2] = (RTCHitN)auVar155[2];
                          local_228[3] = (RTCHitN)auVar155[3];
                          local_228[4] = (RTCHitN)auVar155[4];
                          local_228[5] = (RTCHitN)auVar155[5];
                          local_228[6] = (RTCHitN)auVar155[6];
                          local_228[7] = (RTCHitN)auVar155[7];
                          local_228[8] = (RTCHitN)auVar155[8];
                          local_228[9] = (RTCHitN)auVar155[9];
                          local_228[10] = (RTCHitN)auVar155[10];
                          local_228[0xb] = (RTCHitN)auVar155[0xb];
                          local_228[0xc] = (RTCHitN)auVar155[0xc];
                          local_228[0xd] = (RTCHitN)auVar155[0xd];
                          local_228[0xe] = (RTCHitN)auVar155[0xe];
                          local_228[0xf] = (RTCHitN)auVar155[0xf];
                          local_218 = auVar159;
                          uStack_204 = local_208;
                          uStack_200 = local_208;
                          uStack_1fc = local_208;
                          fStack_1f4 = local_1f8;
                          fStack_1f0 = local_1f8;
                          fStack_1ec = local_1f8;
                          local_1e8 = auVar158;
                          local_1d8 = CONCAT44(uStack_374,local_378);
                          uStack_1d0 = CONCAT44(uStack_36c,uStack_370);
                          local_1c8._4_4_ = uStack_364;
                          local_1c8._0_4_ = local_368;
                          local_1c8._8_4_ = uStack_360;
                          local_1c8._12_4_ = uStack_35c;
                          vpcmpeqd_avx2(ZEXT1632(local_1c8),ZEXT1632(local_1c8));
                          uStack_1b4 = context->user->instID[0];
                          local_1b8 = uStack_1b4;
                          uStack_1b0 = uStack_1b4;
                          uStack_1ac = uStack_1b4;
                          uStack_1a8 = context->user->instPrimID[0];
                          uStack_1a4 = uStack_1a8;
                          uStack_1a0 = uStack_1a8;
                          uStack_19c = uStack_1a8;
                          *(float *)(ray + k * 4 + 0x80) = fVar139;
                          local_468 = *local_458;
                          local_428.valid = (int *)local_468;
                          local_428.geometryUserPtr = pGVar8->userPtr;
                          local_428.context = context->user;
                          local_428.hit = local_228;
                          local_428.N = 4;
                          local_428.ray = (RTCRayN *)ray;
                          if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar8->intersectionFilterN)(&local_428);
                            auVar199._8_56_ = extraout_var;
                            auVar199._0_8_ = extraout_XMM1_Qa;
                            auVar159 = auVar199._0_16_;
                          }
                          if (local_468 == (undefined1  [16])0x0) {
                            auVar158 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar159 = vpcmpeqd_avx(auVar159,auVar159);
                            auVar158 = auVar158 ^ auVar159;
                          }
                          else {
                            p_Var14 = context->args->filter;
                            auVar159 = vpcmpeqd_avx(auVar158,auVar158);
                            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var14)(&local_428);
                              auVar159 = vpcmpeqd_avx(auVar159,auVar159);
                            }
                            auVar155 = vpcmpeqd_avx(local_468,_DAT_01f7aa10);
                            auVar158 = auVar155 ^ auVar159;
                            if (local_468 != (undefined1  [16])0x0) {
                              auVar155 = auVar155 ^ auVar159;
                              auVar159 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])local_428.hit
                                                       );
                              *(undefined1 (*) [16])(local_428.ray + 0xc0) = auVar159;
                              auVar159 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x10));
                              *(undefined1 (*) [16])(local_428.ray + 0xd0) = auVar159;
                              auVar159 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x20));
                              *(undefined1 (*) [16])(local_428.ray + 0xe0) = auVar159;
                              auVar159 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x30));
                              *(undefined1 (*) [16])(local_428.ray + 0xf0) = auVar159;
                              auVar159 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x40));
                              *(undefined1 (*) [16])(local_428.ray + 0x100) = auVar159;
                              auVar159 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x50));
                              *(undefined1 (*) [16])(local_428.ray + 0x110) = auVar159;
                              auVar159 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x60));
                              *(undefined1 (*) [16])(local_428.ray + 0x120) = auVar159;
                              auVar159 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x70));
                              *(undefined1 (*) [16])(local_428.ray + 0x130) = auVar159;
                              auVar159 = vmaskmovps_avx(auVar155,*(undefined1 (*) [16])
                                                                  (local_428.hit + 0x80));
                              *(undefined1 (*) [16])(local_428.ray + 0x140) = auVar159;
                            }
                          }
                          auVar90._8_8_ = 0x100000001;
                          auVar90._0_8_ = 0x100000001;
                          if ((auVar90 & auVar158) == (undefined1  [16])0x0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar141;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar61 = lVar61 + -1;
              } while (lVar61 != 0);
            }
          }
        }
        else {
          auVar291 = vcmpps_avx(auVar291,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar107 = vcmpps_avx(auVar70,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar291 = vandps_avx(auVar107,auVar291);
          if (-0.0001 < fVar126 && (auVar291 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_016daef5;
        }
        if (uVar66 == 0) break;
      } while( true );
    }
    uVar69 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar91._4_4_ = uVar69;
    auVar91._0_4_ = uVar69;
    auVar91._8_4_ = uVar69;
    auVar91._12_4_ = uVar69;
    auVar158 = vcmpps_avx(local_358,auVar91,2);
    uVar58 = vmovmskps_avx(auVar158);
    uVar57 = uVar57 & uVar57 + 0xf & uVar58;
    if (uVar57 == 0) {
      return;
    }
  } while( true );
LAB_016dbb60:
  auVar158 = vinsertps_avx(auVar158,ZEXT416((uint)fVar144),0x10);
  auVar289 = ZEXT1664(auVar158);
  auVar158 = vinsertps_avx(auVar202,ZEXT416((uint)auVar218._0_4_),0x10);
  auVar199 = ZEXT1664(auVar158);
  goto LAB_016da636;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }